

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersector1<4>::
     intersect_hn<embree::avx2::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  long lVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  uint uVar47;
  uint uVar48;
  ulong uVar49;
  long lVar51;
  byte bVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  uint uVar56;
  undefined4 uVar57;
  undefined8 unaff_RBP;
  float fVar58;
  float fVar59;
  float fVar86;
  float fVar88;
  vint4 bi_2;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar87;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined8 uVar89;
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  vint4 ai_2;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  vint4 ai;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  float fVar139;
  float fVar140;
  float fVar153;
  float fVar154;
  vint4 bi;
  undefined1 auVar141 [16];
  float fVar155;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  vint4 ai_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar186;
  float fVar187;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar188;
  undefined1 auVar185 [32];
  __m128 a;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar214;
  vfloat4 a0_1;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar232;
  float fVar241;
  float fVar242;
  vfloat4 a0;
  undefined1 auVar234 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar243;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar262 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_53c;
  undefined1 local_538 [16];
  undefined1 local_528 [8];
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  long local_4d0;
  Primitive *local_4c8;
  ulong local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [32];
  RTCFilterFunctionNArguments local_398;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 auStack_358 [16];
  undefined1 local_348 [32];
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  uint auStack_2e8 [4];
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2cc;
  uint local_2c4;
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  undefined1 local_2a8 [32];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  uint uStack_1d8;
  float afStack_1d4 [7];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  ulong uVar50;
  undefined1 auVar261 [32];
  
  PVar3 = prim[1];
  uVar49 = (ulong)(byte)PVar3;
  fVar58 = *(float *)(prim + uVar49 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar49 * 0x19 + 6));
  auVar156._0_4_ = fVar58 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar156._4_4_ = fVar58 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar156._8_4_ = fVar58 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar156._12_4_ = fVar58 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 4 + 6)));
  auVar60._0_4_ = fVar58 * auVar12._0_4_;
  auVar60._4_4_ = fVar58 * auVar12._4_4_;
  auVar60._8_4_ = fVar58 * auVar12._8_4_;
  auVar60._12_4_ = fVar58 * auVar12._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xb + 6)));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xc + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xd + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x12 + 6)));
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x13 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar227 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x14 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar251._4_4_ = auVar156._0_4_;
  auVar251._0_4_ = auVar156._0_4_;
  auVar251._8_4_ = auVar156._0_4_;
  auVar251._12_4_ = auVar156._0_4_;
  auVar105 = vshufps_avx(auVar156,auVar156,0x55);
  auVar61 = vshufps_avx(auVar156,auVar156,0xaa);
  fVar58 = auVar61._0_4_;
  auVar215._0_4_ = fVar58 * auVar124._0_4_;
  fVar86 = auVar61._4_4_;
  auVar215._4_4_ = fVar86 * auVar124._4_4_;
  fVar116 = auVar61._8_4_;
  auVar215._8_4_ = fVar116 * auVar124._8_4_;
  fVar87 = auVar61._12_4_;
  auVar215._12_4_ = fVar87 * auVar124._12_4_;
  auVar199._0_4_ = auVar234._0_4_ * fVar58;
  auVar199._4_4_ = auVar234._4_4_ * fVar86;
  auVar199._8_4_ = auVar234._8_4_ * fVar116;
  auVar199._12_4_ = auVar234._12_4_ * fVar87;
  auVar189._0_4_ = auVar227._0_4_ * fVar58;
  auVar189._4_4_ = auVar227._4_4_ * fVar86;
  auVar189._8_4_ = auVar227._8_4_ * fVar116;
  auVar189._12_4_ = auVar227._12_4_ * fVar87;
  auVar61 = vfmadd231ps_fma(auVar215,auVar105,auVar12);
  auVar121 = vfmadd231ps_fma(auVar199,auVar105,auVar11);
  auVar105 = vfmadd231ps_fma(auVar189,auVar62,auVar105);
  auVar117 = vfmadd231ps_fma(auVar61,auVar251,auVar9);
  auVar121 = vfmadd231ps_fma(auVar121,auVar251,auVar10);
  auVar130 = vfmadd231ps_fma(auVar105,auVar63,auVar251);
  auVar252._4_4_ = auVar60._0_4_;
  auVar252._0_4_ = auVar60._0_4_;
  auVar252._8_4_ = auVar60._0_4_;
  auVar252._12_4_ = auVar60._0_4_;
  auVar105 = vshufps_avx(auVar60,auVar60,0x55);
  auVar61 = vshufps_avx(auVar60,auVar60,0xaa);
  fVar58 = auVar61._0_4_;
  auVar157._0_4_ = fVar58 * auVar124._0_4_;
  fVar86 = auVar61._4_4_;
  auVar157._4_4_ = fVar86 * auVar124._4_4_;
  fVar116 = auVar61._8_4_;
  auVar157._8_4_ = fVar116 * auVar124._8_4_;
  fVar87 = auVar61._12_4_;
  auVar157._12_4_ = fVar87 * auVar124._12_4_;
  auVar90._0_4_ = auVar234._0_4_ * fVar58;
  auVar90._4_4_ = auVar234._4_4_ * fVar86;
  auVar90._8_4_ = auVar234._8_4_ * fVar116;
  auVar90._12_4_ = auVar234._12_4_ * fVar87;
  auVar61._0_4_ = auVar227._0_4_ * fVar58;
  auVar61._4_4_ = auVar227._4_4_ * fVar86;
  auVar61._8_4_ = auVar227._8_4_ * fVar116;
  auVar61._12_4_ = auVar227._12_4_ * fVar87;
  auVar12 = vfmadd231ps_fma(auVar157,auVar105,auVar12);
  auVar124 = vfmadd231ps_fma(auVar90,auVar105,auVar11);
  auVar11 = vfmadd231ps_fma(auVar61,auVar105,auVar62);
  auVar62 = vfmadd231ps_fma(auVar12,auVar252,auVar9);
  auVar227 = vfmadd231ps_fma(auVar124,auVar252,auVar10);
  local_318._8_4_ = 0x7fffffff;
  local_318._0_8_ = 0x7fffffff7fffffff;
  local_318._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar117,local_318);
  auVar173._8_4_ = 0x219392ef;
  auVar173._0_8_ = 0x219392ef219392ef;
  auVar173._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar173,1);
  auVar12 = vblendvps_avx(auVar117,auVar173,auVar9);
  auVar9 = vandps_avx(auVar121,local_318);
  auVar9 = vcmpps_avx(auVar9,auVar173,1);
  auVar124 = vblendvps_avx(auVar121,auVar173,auVar9);
  auVar9 = vandps_avx(auVar130,local_318);
  auVar9 = vcmpps_avx(auVar9,auVar173,1);
  auVar9 = vblendvps_avx(auVar130,auVar173,auVar9);
  auVar105 = vfmadd231ps_fma(auVar11,auVar252,auVar63);
  auVar10 = vrcpps_avx(auVar12);
  auVar174._8_4_ = 0x3f800000;
  auVar174._0_8_ = 0x3f8000003f800000;
  auVar174._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar10,auVar174);
  auVar10 = vfmadd132ps_fma(auVar12,auVar10,auVar10);
  auVar12 = vrcpps_avx(auVar124);
  auVar124 = vfnmadd213ps_fma(auVar124,auVar12,auVar174);
  auVar234 = vfmadd132ps_fma(auVar124,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar12,auVar174);
  auVar63 = vfmadd132ps_fma(auVar9,auVar12,auVar12);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar49 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar62);
  auVar130._0_4_ = auVar10._0_4_ * auVar9._0_4_;
  auVar130._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar130._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar130._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar49 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar62);
  auVar141._0_4_ = auVar10._0_4_ * auVar9._0_4_;
  auVar141._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar141._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar141._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar49 * 0xe + 6);
  auVar9 = vpmovsxwd_avx(auVar124);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar227);
  auVar158._0_4_ = auVar234._0_4_ * auVar9._0_4_;
  auVar158._4_4_ = auVar234._4_4_ * auVar9._4_4_;
  auVar158._8_4_ = auVar234._8_4_ * auVar9._8_4_;
  auVar158._12_4_ = auVar234._12_4_ * auVar9._12_4_;
  auVar121._1_3_ = 0;
  auVar121[0] = PVar3;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar12 = vsubps_avx(auVar9,auVar227);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar49 * 0x15 + 6);
  auVar9 = vpmovsxwd_avx(auVar11);
  auVar227._0_4_ = auVar234._0_4_ * auVar12._0_4_;
  auVar227._4_4_ = auVar234._4_4_ * auVar12._4_4_;
  auVar227._8_4_ = auVar234._8_4_ * auVar12._8_4_;
  auVar227._12_4_ = auVar234._12_4_ * auVar12._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar105);
  auVar117._0_4_ = auVar63._0_4_ * auVar9._0_4_;
  auVar117._4_4_ = auVar63._4_4_ * auVar9._4_4_;
  auVar117._8_4_ = auVar63._8_4_ * auVar9._8_4_;
  auVar117._12_4_ = auVar63._12_4_ * auVar9._12_4_;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar49 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar234);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar105);
  auVar62._0_4_ = auVar63._0_4_ * auVar9._0_4_;
  auVar62._4_4_ = auVar63._4_4_ * auVar9._4_4_;
  auVar62._8_4_ = auVar63._8_4_ * auVar9._8_4_;
  auVar62._12_4_ = auVar63._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar130,auVar141);
  auVar12 = vpminsd_avx(auVar158,auVar227);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  auVar12 = vpminsd_avx(auVar117,auVar62);
  uVar57 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar200._4_4_ = uVar57;
  auVar200._0_4_ = uVar57;
  auVar200._8_4_ = uVar57;
  auVar200._12_4_ = uVar57;
  auVar12 = vmaxps_avx(auVar12,auVar200);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  local_288._0_4_ = auVar9._0_4_ * 0.99999964;
  local_288._4_4_ = auVar9._4_4_ * 0.99999964;
  local_288._8_4_ = auVar9._8_4_ * 0.99999964;
  local_288._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar130,auVar141);
  auVar12 = vpmaxsd_avx(auVar158,auVar227);
  auVar9 = vminps_avx(auVar9,auVar12);
  auVar12 = vpmaxsd_avx(auVar117,auVar62);
  fVar58 = (ray->super_RayK<1>).tfar;
  auVar105._4_4_ = fVar58;
  auVar105._0_4_ = fVar58;
  auVar105._8_4_ = fVar58;
  auVar105._12_4_ = fVar58;
  auVar12 = vminps_avx(auVar12,auVar105);
  auVar9 = vminps_avx(auVar9,auVar12);
  auVar63._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar63._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar63._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar63._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar121[4] = PVar3;
  auVar121._5_3_ = 0;
  auVar121[8] = PVar3;
  auVar121._9_3_ = 0;
  auVar121[0xc] = PVar3;
  auVar121._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar121,_DAT_01f4ad30);
  auVar9 = vcmpps_avx(local_288,auVar63,2);
  auVar9 = vandps_avx(auVar9,auVar12);
  uVar57 = vmovmskps_avx(auVar9);
  uVar49 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar57);
  auVar83._16_16_ = mm_lookupmask_ps._240_16_;
  auVar83._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar83,ZEXT832(0) << 0x20,0x80);
LAB_01156c8e:
  if (uVar49 == 0) {
    return;
  }
  lVar51 = 0;
  for (uVar54 = uVar49; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar51 = lVar51 + 1;
  }
  uVar48 = *(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[uVar48].ptr;
  local_4c0 = (ulong)*(uint *)(prim + lVar51 * 4 + 6);
  lVar5 = *(long *)&pGVar4[1].time_range.upper;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(prim + lVar51 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar9 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * uVar54);
  lVar51 = uVar54 + 1;
  auVar12 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * lVar51);
  _Var6 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar124 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * uVar54);
  auVar10 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * lVar51);
  auVar64._8_4_ = 0x3eaaaaab;
  auVar64._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar64._12_4_ = 0x3eaaaaab;
  auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar4[2].intersectionFilterN +
                             (long)pGVar4[2].pointQueryFunc * uVar54),auVar9,auVar64);
  auVar227 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                               (pGVar4[2].intersectionFilterN +
                               (long)pGVar4[2].pointQueryFunc * lVar51),auVar12,auVar64);
  auVar234 = vfmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar4[3].userPtr +
                              uVar54 * *(long *)&pGVar4[3].fnumTimeSegments),auVar124,auVar64);
  auVar105 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                               ((long)pGVar4[3].userPtr +
                               *(long *)&pGVar4[3].fnumTimeSegments * lVar51),auVar10,auVar64);
  auVar121 = ZEXT816(0) << 0x40;
  auVar65._0_4_ = auVar12._0_4_ * 0.0;
  auVar65._4_4_ = auVar12._4_4_ * 0.0;
  auVar65._8_4_ = auVar12._8_4_ * 0.0;
  auVar65._12_4_ = auVar12._12_4_ * 0.0;
  auVar62 = vfmadd231ps_fma(auVar65,auVar227,auVar121);
  auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar62);
  local_528._0_4_ = auVar9._0_4_ + auVar63._0_4_;
  local_528._4_4_ = auVar9._4_4_ + auVar63._4_4_;
  uStack_520._0_4_ = auVar9._8_4_ + auVar63._8_4_;
  uStack_520._4_4_ = auVar9._12_4_ + auVar63._12_4_;
  auVar244._8_4_ = 0x40400000;
  auVar244._0_8_ = 0x4040000040400000;
  auVar244._12_4_ = 0x40400000;
  auVar63 = vfmadd231ps_fma(auVar62,auVar11,auVar244);
  auVar61 = vfnmadd231ps_fma(auVar63,auVar9,auVar244);
  auVar201._0_4_ = auVar10._0_4_ * 0.0;
  auVar201._4_4_ = auVar10._4_4_ * 0.0;
  auVar201._8_4_ = auVar10._8_4_ * 0.0;
  auVar201._12_4_ = auVar10._12_4_ * 0.0;
  auVar62 = vfmadd231ps_fma(auVar201,auVar105,auVar121);
  auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar234,auVar62);
  auVar233._0_4_ = auVar124._0_4_ + auVar63._0_4_;
  auVar233._4_4_ = auVar124._4_4_ + auVar63._4_4_;
  auVar233._8_4_ = auVar124._8_4_ + auVar63._8_4_;
  auVar233._12_4_ = auVar124._12_4_ + auVar63._12_4_;
  auVar63 = vfmadd231ps_fma(auVar62,auVar234,auVar244);
  auVar62 = vfnmadd231ps_fma(auVar63,auVar124,auVar244);
  auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar227,auVar12);
  auVar63 = vfmadd231ps_fma(auVar63,auVar11,auVar121);
  auVar63 = vfmadd231ps_fma(auVar63,auVar9,auVar121);
  auVar118._0_4_ = auVar12._0_4_ * 3.0;
  auVar118._4_4_ = auVar12._4_4_ * 3.0;
  auVar118._8_4_ = auVar12._8_4_ * 3.0;
  auVar118._12_4_ = auVar12._12_4_ * 3.0;
  auVar12 = vfnmadd231ps_fma(auVar118,auVar244,auVar227);
  auVar12 = vfmadd231ps_fma(auVar12,auVar121,auVar11);
  auVar227 = vfnmadd231ps_fma(auVar12,auVar121,auVar9);
  auVar9 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar105,auVar10);
  auVar9 = vfmadd231ps_fma(auVar9,auVar234,auVar121);
  auVar11 = vfmadd231ps_fma(auVar9,auVar124,auVar121);
  auVar159._0_4_ = auVar10._0_4_ * 3.0;
  auVar159._4_4_ = auVar10._4_4_ * 3.0;
  auVar159._8_4_ = auVar10._8_4_ * 3.0;
  auVar159._12_4_ = auVar10._12_4_ * 3.0;
  auVar9 = vfnmadd231ps_fma(auVar159,auVar244,auVar105);
  auVar9 = vfmadd231ps_fma(auVar9,auVar121,auVar234);
  auVar234 = vfnmadd231ps_fma(auVar9,auVar121,auVar124);
  auVar9 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar12 = vshufps_avx(auVar233,auVar233,0xc9);
  fVar172 = auVar61._0_4_;
  auVar175._0_4_ = fVar172 * auVar12._0_4_;
  fVar186 = auVar61._4_4_;
  auVar175._4_4_ = fVar186 * auVar12._4_4_;
  fVar187 = auVar61._8_4_;
  auVar175._8_4_ = fVar187 * auVar12._8_4_;
  fVar188 = auVar61._12_4_;
  auVar175._12_4_ = fVar188 * auVar12._12_4_;
  auVar12 = vfmsub231ps_fma(auVar175,auVar9,auVar233);
  auVar124 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar190._0_4_ = auVar12._0_4_ * fVar172;
  auVar190._4_4_ = auVar12._4_4_ * fVar186;
  auVar190._8_4_ = auVar12._8_4_ * fVar187;
  auVar190._12_4_ = auVar12._12_4_ * fVar188;
  auVar9 = vfmsub231ps_fma(auVar190,auVar9,auVar62);
  auVar10 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar12 = vshufps_avx(auVar227,auVar227,0xc9);
  auVar9 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar58 = auVar227._0_4_;
  auVar202._0_4_ = auVar9._0_4_ * fVar58;
  fVar86 = auVar227._4_4_;
  auVar202._4_4_ = auVar9._4_4_ * fVar86;
  fVar116 = auVar227._8_4_;
  auVar202._8_4_ = auVar9._8_4_ * fVar116;
  fVar87 = auVar227._12_4_;
  auVar202._12_4_ = auVar9._12_4_ * fVar87;
  auVar9 = vfmsub231ps_fma(auVar202,auVar12,auVar11);
  auVar11 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar234,auVar234,0xc9);
  auVar203._0_4_ = auVar9._0_4_ * fVar58;
  auVar203._4_4_ = auVar9._4_4_ * fVar86;
  auVar203._8_4_ = auVar9._8_4_ * fVar116;
  auVar203._12_4_ = auVar9._12_4_ * fVar87;
  auVar9 = vdpps_avx(auVar124,auVar124,0x7f);
  auVar12 = vfmsub231ps_fma(auVar203,auVar12,auVar234);
  auVar234 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar59 = auVar9._0_4_;
  auVar204._4_12_ = ZEXT812(0) << 0x20;
  auVar204._0_4_ = fVar59;
  auVar12 = vrsqrtss_avx(auVar204,auVar204);
  fVar88 = auVar12._0_4_;
  fVar140 = fVar88 * 1.5 - fVar59 * 0.5 * fVar88 * fVar88 * fVar88;
  fVar139 = fVar140 * auVar124._0_4_;
  fVar153 = fVar140 * auVar124._4_4_;
  fVar154 = fVar140 * auVar124._8_4_;
  fVar155 = fVar140 * auVar124._12_4_;
  auVar12 = vdpps_avx(auVar124,auVar10,0x7f);
  auVar191._0_4_ = fVar59 * auVar10._0_4_;
  auVar191._4_4_ = fVar59 * auVar10._4_4_;
  auVar191._8_4_ = fVar59 * auVar10._8_4_;
  auVar191._12_4_ = fVar59 * auVar10._12_4_;
  fVar88 = auVar12._0_4_;
  auVar176._0_4_ = fVar88 * auVar124._0_4_;
  auVar176._4_4_ = fVar88 * auVar124._4_4_;
  auVar176._8_4_ = fVar88 * auVar124._8_4_;
  auVar176._12_4_ = fVar88 * auVar124._12_4_;
  auVar124 = vsubps_avx(auVar191,auVar176);
  auVar12 = vrcpss_avx(auVar204,auVar204);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar12,SUB6416(ZEXT464(0x40000000),0));
  fVar88 = auVar12._0_4_ * auVar9._0_4_;
  auVar9 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar59 = auVar9._0_4_;
  auVar192._4_12_ = ZEXT812(0) << 0x20;
  auVar192._0_4_ = fVar59;
  auVar12 = vrsqrtss_avx(auVar192,auVar192);
  fVar214 = auVar12._0_4_;
  fVar214 = fVar214 * 1.5 - fVar59 * 0.5 * fVar214 * fVar214 * fVar214;
  auVar12 = vdpps_avx(auVar11,auVar234,0x7f);
  fVar232 = fVar214 * auVar11._0_4_;
  fVar241 = fVar214 * auVar11._4_4_;
  fVar242 = fVar214 * auVar11._8_4_;
  fVar243 = fVar214 * auVar11._12_4_;
  auVar160._0_4_ = fVar59 * auVar234._0_4_;
  auVar160._4_4_ = fVar59 * auVar234._4_4_;
  auVar160._8_4_ = fVar59 * auVar234._8_4_;
  auVar160._12_4_ = fVar59 * auVar234._12_4_;
  fVar59 = auVar12._0_4_;
  auVar131._0_4_ = fVar59 * auVar11._0_4_;
  auVar131._4_4_ = fVar59 * auVar11._4_4_;
  auVar131._8_4_ = fVar59 * auVar11._8_4_;
  auVar131._12_4_ = fVar59 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar160,auVar131);
  auVar12 = vrcpss_avx(auVar192,auVar192);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar12,ZEXT416(0x40000000));
  fVar59 = auVar9._0_4_ * auVar12._0_4_;
  auVar9 = vshufps_avx(_local_528,_local_528,0xff);
  auVar193._0_4_ = auVar9._0_4_ * fVar139;
  auVar193._4_4_ = auVar9._4_4_ * fVar153;
  auVar193._8_4_ = auVar9._8_4_ * fVar154;
  auVar193._12_4_ = auVar9._12_4_ * fVar155;
  local_448 = vsubps_avx(_local_528,auVar193);
  auVar12 = vshufps_avx(auVar61,auVar61,0xff);
  auVar142._0_4_ = auVar12._0_4_ * fVar139 + auVar9._0_4_ * fVar140 * fVar88 * auVar124._0_4_;
  auVar142._4_4_ = auVar12._4_4_ * fVar153 + auVar9._4_4_ * fVar140 * fVar88 * auVar124._4_4_;
  auVar142._8_4_ = auVar12._8_4_ * fVar154 + auVar9._8_4_ * fVar140 * fVar88 * auVar124._8_4_;
  auVar142._12_4_ = auVar12._12_4_ * fVar155 + auVar9._12_4_ * fVar140 * fVar88 * auVar124._12_4_;
  auVar124 = vsubps_avx(auVar61,auVar142);
  local_458._0_4_ = auVar193._0_4_ + (float)local_528._0_4_;
  local_458._4_4_ = auVar193._4_4_ + (float)local_528._4_4_;
  fStack_450 = auVar193._8_4_ + (float)uStack_520;
  fStack_44c = auVar193._12_4_ + uStack_520._4_4_;
  auVar9 = vshufps_avx(auVar63,auVar63,0xff);
  auVar91._0_4_ = fVar232 * auVar9._0_4_;
  auVar91._4_4_ = fVar241 * auVar9._4_4_;
  auVar91._8_4_ = fVar242 * auVar9._8_4_;
  auVar91._12_4_ = fVar243 * auVar9._12_4_;
  local_468 = vsubps_avx(auVar63,auVar91);
  auVar12 = vshufps_avx(auVar227,auVar227,0xff);
  auVar66._0_4_ = fVar232 * auVar12._0_4_ + auVar9._0_4_ * fVar214 * auVar10._0_4_ * fVar59;
  auVar66._4_4_ = fVar241 * auVar12._4_4_ + auVar9._4_4_ * fVar214 * auVar10._4_4_ * fVar59;
  auVar66._8_4_ = fVar242 * auVar12._8_4_ + auVar9._8_4_ * fVar214 * auVar10._8_4_ * fVar59;
  auVar66._12_4_ = fVar243 * auVar12._12_4_ + auVar9._12_4_ * fVar214 * auVar10._12_4_ * fVar59;
  auVar9 = vsubps_avx(auVar227,auVar66);
  local_4b8 = auVar63._0_4_ + auVar91._0_4_;
  fStack_4b4 = auVar63._4_4_ + auVar91._4_4_;
  fStack_4b0 = auVar63._8_4_ + auVar91._8_4_;
  fStack_4ac = auVar63._12_4_ + auVar91._12_4_;
  local_478._0_4_ = local_448._0_4_ + auVar124._0_4_ * 0.33333334;
  local_478._4_4_ = local_448._4_4_ + auVar124._4_4_ * 0.33333334;
  local_478._8_4_ = local_448._8_4_ + auVar124._8_4_ * 0.33333334;
  local_478._12_4_ = local_448._12_4_ + auVar124._12_4_ * 0.33333334;
  auVar67._0_4_ = auVar9._0_4_ * 0.33333334;
  auVar67._4_4_ = auVar9._4_4_ * 0.33333334;
  auVar67._8_4_ = auVar9._8_4_ * 0.33333334;
  auVar67._12_4_ = auVar9._12_4_ * 0.33333334;
  local_488 = vsubps_avx(local_468,auVar67);
  aVar1 = (ray->super_RayK<1>).org.field_0;
  auVar124 = vsubps_avx(local_448,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar124,auVar124,0x55);
  auVar12 = vshufps_avx(auVar124,auVar124,0xaa);
  aVar2 = (pre->ray_space).vy.field_0;
  fVar88 = (pre->ray_space).vz.field_0.m128[0];
  fVar59 = (pre->ray_space).vz.field_0.m128[1];
  fVar140 = (pre->ray_space).vz.field_0.m128[2];
  fVar214 = (pre->ray_space).vz.field_0.m128[3];
  auVar132._0_4_ = fVar88 * auVar12._0_4_;
  auVar132._4_4_ = fVar59 * auVar12._4_4_;
  auVar132._8_4_ = fVar140 * auVar12._8_4_;
  auVar132._12_4_ = fVar214 * auVar12._12_4_;
  auVar105 = vfmadd231ps_fma(auVar132,(undefined1  [16])aVar2,auVar9);
  auVar10 = vsubps_avx(local_478,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar10,auVar10,0x55);
  auVar12 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar68._0_4_ = fVar88 * auVar12._0_4_;
  auVar68._4_4_ = fVar59 * auVar12._4_4_;
  auVar68._8_4_ = fVar140 * auVar12._8_4_;
  auVar68._12_4_ = fVar214 * auVar12._12_4_;
  auVar61 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar2,auVar9);
  auVar12 = vsubps_avx(local_488,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar12,auVar12,0xaa);
  auVar106._0_4_ = fVar88 * auVar9._0_4_;
  auVar106._4_4_ = fVar59 * auVar9._4_4_;
  auVar106._8_4_ = fVar140 * auVar9._8_4_;
  auVar106._12_4_ = fVar214 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar12,auVar12,0x55);
  auVar121 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar2,auVar9);
  auVar11 = vsubps_avx(local_468,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar119._0_4_ = fVar88 * auVar9._0_4_;
  auVar119._4_4_ = fVar59 * auVar9._4_4_;
  auVar119._8_4_ = fVar140 * auVar9._8_4_;
  auVar119._12_4_ = fVar214 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar11,auVar11,0x55);
  auVar117 = vfmadd231ps_fma(auVar119,(undefined1  [16])aVar2,auVar9);
  auVar234 = vsubps_avx(_local_458,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar234,auVar234,0xaa);
  auVar92._0_4_ = fVar88 * auVar9._0_4_;
  auVar92._4_4_ = fVar59 * auVar9._4_4_;
  auVar92._8_4_ = fVar140 * auVar9._8_4_;
  auVar92._12_4_ = fVar214 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar234,auVar234,0x55);
  auVar130 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar2,auVar9);
  local_498._0_4_ = (fVar172 + auVar142._0_4_) * 0.33333334 + (float)local_458._0_4_;
  local_498._4_4_ = (fVar186 + auVar142._4_4_) * 0.33333334 + (float)local_458._4_4_;
  fStack_490 = (fVar187 + auVar142._8_4_) * 0.33333334 + fStack_450;
  fStack_48c = (fVar188 + auVar142._12_4_) * 0.33333334 + fStack_44c;
  auVar63 = vsubps_avx(_local_498,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar63,auVar63,0xaa);
  auVar216._0_4_ = fVar88 * auVar9._0_4_;
  auVar216._4_4_ = fVar59 * auVar9._4_4_;
  auVar216._8_4_ = fVar140 * auVar9._8_4_;
  auVar216._12_4_ = fVar214 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar63,auVar63,0x55);
  auVar60 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar2,auVar9);
  auVar225._0_4_ = (fVar58 + auVar66._0_4_) * 0.33333334;
  auVar225._4_4_ = (fVar86 + auVar66._4_4_) * 0.33333334;
  auVar225._8_4_ = (fVar116 + auVar66._8_4_) * 0.33333334;
  auVar225._12_4_ = (fVar87 + auVar66._12_4_) * 0.33333334;
  auVar42._4_4_ = fStack_4b4;
  auVar42._0_4_ = local_4b8;
  auVar42._8_4_ = fStack_4b0;
  auVar42._12_4_ = fStack_4ac;
  _local_4a8 = vsubps_avx(auVar42,auVar225);
  auVar62 = vsubps_avx(_local_4a8,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar62,auVar62,0xaa);
  auVar226._0_4_ = fVar88 * auVar9._0_4_;
  auVar226._4_4_ = fVar59 * auVar9._4_4_;
  auVar226._8_4_ = fVar140 * auVar9._8_4_;
  auVar226._12_4_ = fVar214 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar62,auVar62,0x55);
  auVar90 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar2,auVar9);
  auVar227 = vsubps_avx(auVar42,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar227,auVar227,0xaa);
  auVar177._0_4_ = fVar88 * auVar9._0_4_;
  auVar177._4_4_ = fVar59 * auVar9._4_4_;
  auVar177._8_4_ = fVar140 * auVar9._8_4_;
  auVar177._12_4_ = fVar214 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar227,auVar227,0x55);
  auVar9 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar2,auVar9);
  local_528._0_4_ = auVar124._0_4_;
  auVar161._4_4_ = local_528._0_4_;
  auVar161._0_4_ = local_528._0_4_;
  auVar161._8_4_ = local_528._0_4_;
  auVar161._12_4_ = local_528._0_4_;
  aVar2 = (pre->ray_space).vx.field_0;
  auVar105 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar2,auVar161);
  local_4e8._0_4_ = auVar10._0_4_;
  auVar162._4_4_ = local_4e8._0_4_;
  auVar162._0_4_ = local_4e8._0_4_;
  auVar162._8_4_ = local_4e8._0_4_;
  auVar162._12_4_ = local_4e8._0_4_;
  auVar10 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar2,auVar162);
  uVar57 = auVar12._0_4_;
  auVar163._4_4_ = uVar57;
  auVar163._0_4_ = uVar57;
  auVar163._8_4_ = uVar57;
  auVar163._12_4_ = uVar57;
  auVar61 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar2,auVar163);
  uVar57 = auVar11._0_4_;
  auVar164._4_4_ = uVar57;
  auVar164._0_4_ = uVar57;
  auVar164._8_4_ = uVar57;
  auVar164._12_4_ = uVar57;
  auVar11 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar2,auVar164);
  uVar57 = auVar234._0_4_;
  auVar165._4_4_ = uVar57;
  auVar165._0_4_ = uVar57;
  auVar165._8_4_ = uVar57;
  auVar165._12_4_ = uVar57;
  auVar234 = vfmadd231ps_fma(auVar130,(undefined1  [16])aVar2,auVar165);
  uVar57 = auVar63._0_4_;
  auVar166._4_4_ = uVar57;
  auVar166._0_4_ = uVar57;
  auVar166._8_4_ = uVar57;
  auVar166._12_4_ = uVar57;
  auVar63 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar2,auVar166);
  uVar57 = auVar62._0_4_;
  auVar69._4_4_ = uVar57;
  auVar69._0_4_ = uVar57;
  auVar69._8_4_ = uVar57;
  auVar69._12_4_ = uVar57;
  auVar62 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar2,auVar69);
  uVar57 = auVar227._0_4_;
  auVar70._4_4_ = uVar57;
  auVar70._0_4_ = uVar57;
  auVar70._8_4_ = uVar57;
  auVar70._12_4_ = uVar57;
  auVar227 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar70);
  local_4e8 = vmovlhps_avx(auVar105,auVar234);
  local_4f8 = vmovlhps_avx(auVar10,auVar63);
  local_508 = vmovlhps_avx(auVar61,auVar62);
  _local_218 = vmovlhps_avx(auVar11,auVar227);
  auVar9 = vminps_avx(local_4e8,local_4f8);
  auVar12 = vminps_avx(local_508,_local_218);
  auVar124 = vminps_avx(auVar9,auVar12);
  auVar9 = vmaxps_avx(local_4e8,local_4f8);
  auVar12 = vmaxps_avx(local_508,_local_218);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  auVar12 = vshufpd_avx(auVar124,auVar124,3);
  auVar124 = vminps_avx(auVar124,auVar12);
  auVar12 = vshufpd_avx(auVar9,auVar9,3);
  auVar12 = vmaxps_avx(auVar9,auVar12);
  auVar9 = vandps_avx(local_318,auVar124);
  auVar12 = vandps_avx(local_318,auVar12);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  auVar12 = vmovshdup_avx(auVar9);
  auVar9 = vmaxss_avx(auVar12,auVar9);
  local_4d0 = uVar49 + 0xf;
  local_78 = auVar9._0_4_ * 9.536743e-07;
  local_3c8._0_8_ = auVar105._0_8_;
  local_3c8._8_8_ = local_3c8._0_8_;
  local_3d8._0_8_ = auVar10._0_8_;
  local_3d8._8_8_ = local_3d8._0_8_;
  local_3e8._8_8_ = auVar61._0_8_;
  local_3e8._0_8_ = auVar61._0_8_;
  local_3f8._8_8_ = auVar11._0_8_;
  local_3f8._0_8_ = auVar11._0_8_;
  register0x00001388 = auVar234._0_8_;
  local_408 = auVar234._0_8_;
  local_418 = auVar63._0_8_;
  register0x00001488 = local_418;
  local_428 = auVar62._0_8_;
  register0x000014c8 = local_428;
  register0x000012c8 = auVar227._0_8_;
  local_438 = auVar227._0_8_;
  local_228 = ZEXT416((uint)local_78);
  local_328 = 0x80000000;
  uStack_324 = 0x80000000;
  uStack_320 = 0x80000000;
  uStack_31c = 0x80000000;
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  fStack_68 = local_78;
  fStack_64 = local_78;
  fStack_60 = local_78;
  fStack_5c = local_78;
  fStack_90 = -local_78;
  local_98 = -local_78;
  fStack_94 = -local_78;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  uVar54 = 0;
  local_1e8 = vsubps_avx(local_4f8,local_4e8);
  local_1f8 = vsubps_avx(local_508,local_4f8);
  local_208 = vsubps_avx(_local_218,local_508);
  local_248 = vsubps_avx(_local_458,local_448);
  local_258 = vsubps_avx(_local_498,local_478);
  local_268 = vsubps_avx(_local_4a8,local_488);
  auVar43._4_4_ = fStack_4b4;
  auVar43._0_4_ = local_4b8;
  auVar43._8_4_ = fStack_4b0;
  auVar43._12_4_ = fStack_4ac;
  _local_278 = vsubps_avx(auVar43,local_468);
  local_538 = ZEXT816(0x3f80000000000000);
  local_4c8 = prim;
  local_238 = local_538;
LAB_01157388:
  auVar9 = vshufps_avx(local_538,local_538,0x50);
  auVar258._8_4_ = 0x3f800000;
  auVar258._0_8_ = 0x3f8000003f800000;
  auVar258._12_4_ = 0x3f800000;
  auVar261._16_4_ = 0x3f800000;
  auVar261._0_16_ = auVar258;
  auVar261._20_4_ = 0x3f800000;
  auVar261._24_4_ = 0x3f800000;
  auVar261._28_4_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar258,auVar9);
  fVar58 = auVar9._0_4_;
  auVar71._0_4_ = local_408._0_4_ * fVar58;
  fVar86 = auVar9._4_4_;
  auVar71._4_4_ = local_408._4_4_ * fVar86;
  fVar116 = auVar9._8_4_;
  auVar71._8_4_ = local_408._8_4_ * fVar116;
  fVar87 = auVar9._12_4_;
  auVar71._12_4_ = local_408._12_4_ * fVar87;
  auVar167._0_4_ = local_418._0_4_ * fVar58;
  auVar167._4_4_ = local_418._4_4_ * fVar86;
  auVar167._8_4_ = local_418._8_4_ * fVar116;
  auVar167._12_4_ = local_418._12_4_ * fVar87;
  auVar133._0_4_ = local_428._0_4_ * fVar58;
  auVar133._4_4_ = local_428._4_4_ * fVar86;
  auVar133._8_4_ = local_428._8_4_ * fVar116;
  auVar133._12_4_ = local_428._12_4_ * fVar87;
  auVar107._0_4_ = local_438._0_4_ * fVar58;
  auVar107._4_4_ = local_438._4_4_ * fVar86;
  auVar107._8_4_ = local_438._8_4_ * fVar116;
  auVar107._12_4_ = local_438._12_4_ * fVar87;
  auVar11 = vfmadd231ps_fma(auVar71,auVar12,local_3c8);
  auVar234 = vfmadd231ps_fma(auVar167,auVar12,local_3d8);
  auVar63 = vfmadd231ps_fma(auVar133,auVar12,local_3e8);
  auVar62 = vfmadd231ps_fma(auVar107,local_3f8,auVar12);
  auVar9 = vmovshdup_avx(local_238);
  fVar58 = local_238._0_4_;
  fStack_140 = (auVar9._0_4_ - fVar58) * 0.04761905;
  auVar212._4_4_ = fVar58;
  auVar212._0_4_ = fVar58;
  auVar212._8_4_ = fVar58;
  auVar212._12_4_ = fVar58;
  auVar212._16_4_ = fVar58;
  auVar212._20_4_ = fVar58;
  auVar212._24_4_ = fVar58;
  auVar212._28_4_ = fVar58;
  auVar102._0_8_ = auVar9._0_8_;
  auVar102._8_8_ = auVar102._0_8_;
  auVar102._16_8_ = auVar102._0_8_;
  auVar102._24_8_ = auVar102._0_8_;
  auVar83 = vsubps_avx(auVar102,auVar212);
  uVar57 = auVar11._0_4_;
  auVar256._4_4_ = uVar57;
  auVar256._0_4_ = uVar57;
  auVar256._8_4_ = uVar57;
  auVar256._12_4_ = uVar57;
  auVar256._16_4_ = uVar57;
  auVar256._20_4_ = uVar57;
  auVar256._24_4_ = uVar57;
  auVar256._28_4_ = uVar57;
  auVar9 = vmovshdup_avx(auVar11);
  uVar89 = auVar9._0_8_;
  auVar250._8_8_ = uVar89;
  auVar250._0_8_ = uVar89;
  auVar250._16_8_ = uVar89;
  auVar250._24_8_ = uVar89;
  fVar172 = auVar234._0_4_;
  auVar238._4_4_ = fVar172;
  auVar238._0_4_ = fVar172;
  auVar238._8_4_ = fVar172;
  auVar238._12_4_ = fVar172;
  auVar238._16_4_ = fVar172;
  auVar238._20_4_ = fVar172;
  auVar238._24_4_ = fVar172;
  auVar238._28_4_ = fVar172;
  auVar12 = vmovshdup_avx(auVar234);
  auVar103._0_8_ = auVar12._0_8_;
  auVar103._8_8_ = auVar103._0_8_;
  auVar103._16_8_ = auVar103._0_8_;
  auVar103._24_8_ = auVar103._0_8_;
  fVar214 = auVar63._0_4_;
  auVar183._4_4_ = fVar214;
  auVar183._0_4_ = fVar214;
  auVar183._8_4_ = fVar214;
  auVar183._12_4_ = fVar214;
  auVar183._16_4_ = fVar214;
  auVar183._20_4_ = fVar214;
  auVar183._24_4_ = fVar214;
  auVar183._28_4_ = fVar214;
  auVar124 = vmovshdup_avx(auVar63);
  auVar197._0_8_ = auVar124._0_8_;
  auVar197._8_8_ = auVar197._0_8_;
  auVar197._16_8_ = auVar197._0_8_;
  auVar197._24_8_ = auVar197._0_8_;
  fVar140 = auVar62._0_4_;
  auVar10 = vmovshdup_avx(auVar62);
  auVar227 = vfmadd132ps_fma(auVar83,auVar212,_DAT_01f7b040);
  auVar83 = vsubps_avx(auVar261,ZEXT1632(auVar227));
  fVar58 = auVar227._0_4_;
  fVar86 = auVar227._4_4_;
  auVar13._4_4_ = fVar172 * fVar86;
  auVar13._0_4_ = fVar172 * fVar58;
  fVar116 = auVar227._8_4_;
  auVar13._8_4_ = fVar172 * fVar116;
  fVar87 = auVar227._12_4_;
  auVar13._12_4_ = fVar172 * fVar87;
  auVar13._16_4_ = fVar172 * 0.0;
  auVar13._20_4_ = fVar172 * 0.0;
  auVar13._24_4_ = fVar172 * 0.0;
  auVar13._28_4_ = 0x3f800000;
  auVar227 = vfmadd231ps_fma(auVar13,auVar83,auVar256);
  fVar88 = auVar12._0_4_;
  fVar59 = auVar12._4_4_;
  auVar14._4_4_ = fVar59 * fVar86;
  auVar14._0_4_ = fVar88 * fVar58;
  auVar14._8_4_ = fVar88 * fVar116;
  auVar14._12_4_ = fVar59 * fVar87;
  auVar14._16_4_ = fVar88 * 0.0;
  auVar14._20_4_ = fVar59 * 0.0;
  auVar14._24_4_ = fVar88 * 0.0;
  auVar14._28_4_ = uVar57;
  auVar105 = vfmadd231ps_fma(auVar14,auVar83,auVar250);
  auVar15._4_4_ = fVar214 * fVar86;
  auVar15._0_4_ = fVar214 * fVar58;
  auVar15._8_4_ = fVar214 * fVar116;
  auVar15._12_4_ = fVar214 * fVar87;
  auVar15._16_4_ = fVar214 * 0.0;
  auVar15._20_4_ = fVar214 * 0.0;
  auVar15._24_4_ = fVar214 * 0.0;
  auVar15._28_4_ = auVar9._4_4_;
  auVar61 = vfmadd231ps_fma(auVar15,auVar83,auVar238);
  fVar88 = auVar124._0_4_;
  fVar59 = auVar124._4_4_;
  auVar8._4_4_ = fVar59 * fVar86;
  auVar8._0_4_ = fVar88 * fVar58;
  auVar8._8_4_ = fVar88 * fVar116;
  auVar8._12_4_ = fVar59 * fVar87;
  auVar8._16_4_ = fVar88 * 0.0;
  auVar8._20_4_ = fVar59 * 0.0;
  auVar8._24_4_ = fVar88 * 0.0;
  auVar8._28_4_ = fVar172;
  auVar121 = vfmadd231ps_fma(auVar8,auVar83,auVar103);
  auVar9 = vshufps_avx(auVar11,auVar11,0xaa);
  local_3b8._8_8_ = auVar9._0_8_;
  local_3b8._0_8_ = local_3b8._8_8_;
  local_3b8._16_8_ = local_3b8._8_8_;
  local_3b8._24_8_ = local_3b8._8_8_;
  auVar12 = vshufps_avx(auVar11,auVar11,0xff);
  uStack_520 = auVar12._0_8_;
  local_528 = (undefined1  [8])uStack_520;
  uStack_518 = uStack_520;
  uStack_510 = uStack_520;
  auVar16._4_4_ = fVar140 * fVar86;
  auVar16._0_4_ = fVar140 * fVar58;
  auVar16._8_4_ = fVar140 * fVar116;
  auVar16._12_4_ = fVar140 * fVar87;
  auVar16._16_4_ = fVar140 * 0.0;
  auVar16._20_4_ = fVar140 * 0.0;
  auVar16._24_4_ = fVar140 * 0.0;
  auVar16._28_4_ = fVar140;
  auVar11 = vfmadd231ps_fma(auVar16,auVar83,auVar183);
  auVar12 = vshufps_avx(auVar234,auVar234,0xaa);
  auVar184._0_8_ = auVar12._0_8_;
  auVar184._8_8_ = auVar184._0_8_;
  auVar184._16_8_ = auVar184._0_8_;
  auVar184._24_8_ = auVar184._0_8_;
  auVar124 = vshufps_avx(auVar234,auVar234,0xff);
  local_348._8_8_ = auVar124._0_8_;
  local_348._0_8_ = local_348._8_8_;
  local_348._16_8_ = local_348._8_8_;
  local_348._24_8_ = local_348._8_8_;
  fVar88 = auVar10._0_4_;
  fVar59 = auVar10._4_4_;
  auVar18._4_4_ = fVar59 * fVar86;
  auVar18._0_4_ = fVar88 * fVar58;
  auVar18._8_4_ = fVar88 * fVar116;
  auVar18._12_4_ = fVar59 * fVar87;
  auVar18._16_4_ = fVar88 * 0.0;
  auVar18._20_4_ = fVar59 * 0.0;
  auVar18._24_4_ = fVar88 * 0.0;
  auVar18._28_4_ = auVar9._4_4_;
  auVar117 = vfmadd231ps_fma(auVar18,auVar83,auVar197);
  auVar240._28_4_ = fVar59;
  auVar240._0_28_ =
       ZEXT1628(CONCAT412(auVar61._12_4_ * fVar87,
                          CONCAT48(auVar61._8_4_ * fVar116,
                                   CONCAT44(auVar61._4_4_ * fVar86,auVar61._0_4_ * fVar58))));
  auVar227 = vfmadd231ps_fma(auVar240,auVar83,ZEXT1632(auVar227));
  fVar88 = auVar124._4_4_;
  auVar19._28_4_ = fVar88;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar121._12_4_ * fVar87,
                          CONCAT48(auVar121._8_4_ * fVar116,
                                   CONCAT44(auVar121._4_4_ * fVar86,auVar121._0_4_ * fVar58))));
  auVar105 = vfmadd231ps_fma(auVar19,auVar83,ZEXT1632(auVar105));
  auVar9 = vshufps_avx(auVar63,auVar63,0xaa);
  uVar89 = auVar9._0_8_;
  auVar171._8_8_ = uVar89;
  auVar171._0_8_ = uVar89;
  auVar171._16_8_ = uVar89;
  auVar171._24_8_ = uVar89;
  auVar10 = vshufps_avx(auVar63,auVar63,0xff);
  uVar89 = auVar10._0_8_;
  auVar262._8_8_ = uVar89;
  auVar262._0_8_ = uVar89;
  auVar262._16_8_ = uVar89;
  auVar262._24_8_ = uVar89;
  auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar87,
                                               CONCAT48(auVar11._8_4_ * fVar116,
                                                        CONCAT44(auVar11._4_4_ * fVar86,
                                                                 auVar11._0_4_ * fVar58)))),auVar83,
                            ZEXT1632(auVar61));
  auVar11 = vshufps_avx(auVar62,auVar62,0xaa);
  auVar234 = vshufps_avx(auVar62,auVar62,0xff);
  auVar62 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar117._12_4_,
                                               CONCAT48(fVar116 * auVar117._8_4_,
                                                        CONCAT44(fVar86 * auVar117._4_4_,
                                                                 fVar58 * auVar117._0_4_)))),auVar83
                            ,ZEXT1632(auVar121));
  auVar61 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar63._12_4_,
                                               CONCAT48(fVar116 * auVar63._8_4_,
                                                        CONCAT44(fVar86 * auVar63._4_4_,
                                                                 fVar58 * auVar63._0_4_)))),auVar83,
                            ZEXT1632(auVar227));
  auVar13 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar227));
  auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar62._12_4_,
                                               CONCAT48(fVar116 * auVar62._8_4_,
                                                        CONCAT44(fVar86 * auVar62._4_4_,
                                                                 fVar58 * auVar62._0_4_)))),auVar83,
                            ZEXT1632(auVar105));
  auVar14 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar105));
  fStack_2ec = auVar14._28_4_;
  auVar239._0_4_ = fStack_140 * auVar13._0_4_ * 3.0;
  auVar239._4_4_ = fStack_140 * auVar13._4_4_ * 3.0;
  auVar239._8_4_ = fStack_140 * auVar13._8_4_ * 3.0;
  auVar239._12_4_ = fStack_140 * auVar13._12_4_ * 3.0;
  auVar239._16_4_ = fStack_140 * auVar13._16_4_ * 3.0;
  auVar239._20_4_ = fStack_140 * auVar13._20_4_ * 3.0;
  auVar239._24_4_ = fStack_140 * auVar13._24_4_ * 3.0;
  auVar239._28_4_ = 0;
  local_308._0_4_ = fStack_140 * auVar14._0_4_ * 3.0;
  local_308._4_4_ = fStack_140 * auVar14._4_4_ * 3.0;
  fStack_300 = fStack_140 * auVar14._8_4_ * 3.0;
  fStack_2fc = fStack_140 * auVar14._12_4_ * 3.0;
  fStack_2f8 = fStack_140 * auVar14._16_4_ * 3.0;
  fStack_2f4 = fStack_140 * auVar14._20_4_ * 3.0;
  fStack_2f0 = fStack_140 * auVar14._24_4_ * 3.0;
  fVar59 = auVar12._0_4_;
  fVar140 = auVar12._4_4_;
  auVar20._4_4_ = fVar140 * fVar86;
  auVar20._0_4_ = fVar59 * fVar58;
  auVar20._8_4_ = fVar59 * fVar116;
  auVar20._12_4_ = fVar140 * fVar87;
  auVar20._16_4_ = fVar59 * 0.0;
  auVar20._20_4_ = fVar140 * 0.0;
  auVar20._24_4_ = fVar59 * 0.0;
  auVar20._28_4_ = fStack_2ec;
  auVar12 = vfmadd231ps_fma(auVar20,auVar83,local_3b8);
  fVar59 = auVar124._0_4_;
  auVar21._4_4_ = fVar88 * fVar86;
  auVar21._0_4_ = fVar59 * fVar58;
  auVar21._8_4_ = fVar59 * fVar116;
  auVar21._12_4_ = fVar88 * fVar87;
  auVar21._16_4_ = fVar59 * 0.0;
  auVar21._20_4_ = fVar88 * 0.0;
  auVar21._24_4_ = fVar59 * 0.0;
  auVar21._28_4_ = 0;
  auVar124 = vfmadd231ps_fma(auVar21,auVar83,_local_528);
  fVar88 = auVar9._0_4_;
  fVar59 = auVar9._4_4_;
  auVar22._4_4_ = fVar59 * fVar86;
  auVar22._0_4_ = fVar88 * fVar58;
  auVar22._8_4_ = fVar88 * fVar116;
  auVar22._12_4_ = fVar59 * fVar87;
  auVar22._16_4_ = fVar88 * 0.0;
  auVar22._20_4_ = fVar59 * 0.0;
  auVar22._24_4_ = fVar88 * 0.0;
  auVar22._28_4_ = auVar13._28_4_;
  auVar9 = vfmadd231ps_fma(auVar22,auVar83,auVar184);
  fVar88 = auVar10._0_4_;
  fVar214 = auVar10._4_4_;
  auVar23._4_4_ = fVar214 * fVar86;
  auVar23._0_4_ = fVar88 * fVar58;
  auVar23._8_4_ = fVar88 * fVar116;
  auVar23._12_4_ = fVar214 * fVar87;
  auVar23._16_4_ = fVar88 * 0.0;
  auVar23._20_4_ = fVar214 * 0.0;
  auVar23._24_4_ = fVar88 * 0.0;
  auVar23._28_4_ = fVar140;
  auVar10 = vfmadd231ps_fma(auVar23,auVar83,local_348);
  local_348 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar61));
  fVar88 = auVar11._0_4_;
  fVar59 = auVar11._4_4_;
  auVar24._4_4_ = fVar59 * fVar86;
  auVar24._0_4_ = fVar88 * fVar58;
  auVar24._8_4_ = fVar88 * fVar116;
  auVar24._12_4_ = fVar59 * fVar87;
  auVar24._16_4_ = fVar88 * 0.0;
  auVar24._20_4_ = fVar59 * 0.0;
  auVar24._24_4_ = fVar88 * 0.0;
  auVar24._28_4_ = fVar59;
  auVar11 = vfmadd231ps_fma(auVar24,auVar83,auVar171);
  _local_528 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar63));
  auVar18 = _local_528;
  fVar88 = auVar234._0_4_;
  fVar59 = auVar234._4_4_;
  auVar25._4_4_ = fVar59 * fVar86;
  auVar25._0_4_ = fVar88 * fVar58;
  auVar25._8_4_ = fVar88 * fVar116;
  auVar25._12_4_ = fVar59 * fVar87;
  auVar25._16_4_ = fVar88 * 0.0;
  auVar25._20_4_ = fVar59 * 0.0;
  auVar25._24_4_ = fVar88 * 0.0;
  auVar25._28_4_ = fVar59;
  auVar234 = vfmadd231ps_fma(auVar25,auVar83,auVar262);
  auVar26._28_4_ = fVar214;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar9._12_4_ * fVar87,
                          CONCAT48(auVar9._8_4_ * fVar116,
                                   CONCAT44(auVar9._4_4_ * fVar86,auVar9._0_4_ * fVar58))));
  auVar12 = vfmadd231ps_fma(auVar26,auVar83,ZEXT1632(auVar12));
  auVar124 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar10._12_4_,
                                                CONCAT48(fVar116 * auVar10._8_4_,
                                                         CONCAT44(fVar86 * auVar10._4_4_,
                                                                  fVar58 * auVar10._0_4_)))),auVar83
                             ,ZEXT1632(auVar124));
  local_3b8._0_4_ = auVar61._0_4_ + auVar239._0_4_;
  local_3b8._4_4_ = auVar61._4_4_ + auVar239._4_4_;
  local_3b8._8_4_ = auVar61._8_4_ + auVar239._8_4_;
  local_3b8._12_4_ = auVar61._12_4_ + auVar239._12_4_;
  local_3b8._16_4_ = auVar239._16_4_ + 0.0;
  local_3b8._20_4_ = auVar239._20_4_ + 0.0;
  local_3b8._24_4_ = auVar239._24_4_ + 0.0;
  local_3b8._28_4_ = 0;
  auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar87,
                                              CONCAT48(auVar11._8_4_ * fVar116,
                                                       CONCAT44(auVar11._4_4_ * fVar86,
                                                                auVar11._0_4_ * fVar58)))),auVar83,
                           ZEXT1632(auVar9));
  auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar234._12_4_ * fVar87,
                                               CONCAT48(auVar234._8_4_ * fVar116,
                                                        CONCAT44(auVar234._4_4_ * fVar86,
                                                                 auVar234._0_4_ * fVar58)))),auVar83
                            ,ZEXT1632(auVar10));
  auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar9._12_4_,
                                               CONCAT48(fVar116 * auVar9._8_4_,
                                                        CONCAT44(fVar86 * auVar9._4_4_,
                                                                 fVar58 * auVar9._0_4_)))),auVar83,
                            ZEXT1632(auVar12));
  auVar234 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar10._12_4_ * fVar87,
                                                CONCAT48(auVar10._8_4_ * fVar116,
                                                         CONCAT44(auVar10._4_4_ * fVar86,
                                                                  auVar10._0_4_ * fVar58)))),
                             ZEXT1632(auVar124),auVar83);
  auVar83 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
  auVar13 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar124));
  auVar257._0_4_ = fStack_140 * auVar83._0_4_ * 3.0;
  auVar257._4_4_ = fStack_140 * auVar83._4_4_ * 3.0;
  auVar257._8_4_ = fStack_140 * auVar83._8_4_ * 3.0;
  auVar257._12_4_ = fStack_140 * auVar83._12_4_ * 3.0;
  auVar257._16_4_ = fStack_140 * auVar83._16_4_ * 3.0;
  auVar257._20_4_ = fStack_140 * auVar83._20_4_ * 3.0;
  auVar257._24_4_ = fStack_140 * auVar83._24_4_ * 3.0;
  auVar257._28_4_ = 0;
  local_158 = fStack_140 * auVar13._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar13._4_4_ * 3.0;
  auVar27._4_4_ = fStack_154;
  auVar27._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar13._8_4_ * 3.0;
  auVar27._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar13._12_4_ * 3.0;
  auVar27._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar13._16_4_ * 3.0;
  auVar27._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar13._20_4_ * 3.0;
  auVar27._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar13._24_4_ * 3.0;
  auVar27._24_4_ = fStack_140;
  auVar27._28_4_ = 0x40400000;
  _local_368 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar11));
  local_2a8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar234));
  auVar83 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar61));
  auVar13 = vsubps_avx(ZEXT1632(auVar234),ZEXT1632(auVar63));
  auVar14 = vsubps_avx(_local_368,local_348);
  fVar172 = auVar83._0_4_ + auVar14._0_4_;
  fVar186 = auVar83._4_4_ + auVar14._4_4_;
  fVar187 = auVar83._8_4_ + auVar14._8_4_;
  fVar188 = auVar83._12_4_ + auVar14._12_4_;
  fVar139 = auVar83._16_4_ + auVar14._16_4_;
  fVar153 = auVar83._20_4_ + auVar14._20_4_;
  fVar154 = auVar83._24_4_ + auVar14._24_4_;
  auVar15 = vsubps_avx(local_2a8,_local_528);
  auVar84._0_4_ = auVar13._0_4_ + auVar15._0_4_;
  auVar84._4_4_ = auVar13._4_4_ + auVar15._4_4_;
  auVar84._8_4_ = auVar13._8_4_ + auVar15._8_4_;
  auVar84._12_4_ = auVar13._12_4_ + auVar15._12_4_;
  auVar84._16_4_ = auVar13._16_4_ + auVar15._16_4_;
  auVar84._20_4_ = auVar13._20_4_ + auVar15._20_4_;
  auVar84._24_4_ = auVar13._24_4_ + auVar15._24_4_;
  auVar84._28_4_ = auVar13._28_4_ + auVar15._28_4_;
  local_f8 = ZEXT1632(auVar63);
  fVar58 = auVar63._0_4_;
  local_178 = (float)local_308._0_4_ + fVar58;
  fVar86 = auVar63._4_4_;
  fStack_174 = (float)local_308._4_4_ + fVar86;
  fVar116 = auVar63._8_4_;
  fStack_170 = fStack_300 + fVar116;
  fVar87 = auVar63._12_4_;
  fStack_16c = fStack_2fc + fVar87;
  fStack_168 = fStack_2f8 + 0.0;
  fStack_164 = fStack_2f4 + 0.0;
  fStack_160 = fStack_2f0 + 0.0;
  local_b8 = ZEXT1632(auVar61);
  auVar13 = vsubps_avx(local_b8,auVar239);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar13 = vsubps_avx(local_f8,_local_308);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar13);
  local_118._0_4_ = auVar11._0_4_ + auVar257._0_4_;
  local_118._4_4_ = auVar11._4_4_ + auVar257._4_4_;
  local_118._8_4_ = auVar11._8_4_ + auVar257._8_4_;
  local_118._12_4_ = auVar11._12_4_ + auVar257._12_4_;
  local_118._16_4_ = auVar257._16_4_ + 0.0;
  local_118._20_4_ = auVar257._20_4_ + 0.0;
  local_118._24_4_ = auVar257._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar240 = ZEXT1632(auVar11);
  auVar13 = vsubps_avx(auVar240,auVar257);
  auVar16 = vpermps_avx2(_DAT_01fb7720,auVar13);
  fVar88 = auVar234._0_4_;
  local_158 = fVar88 + local_158;
  fVar59 = auVar234._4_4_;
  fStack_154 = fVar59 + fStack_154;
  fVar140 = auVar234._8_4_;
  fStack_150 = fVar140 + fStack_150;
  fVar214 = auVar234._12_4_;
  fStack_14c = fVar214 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar13 = vsubps_avx(ZEXT1632(auVar234),auVar27);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar28._4_4_ = fVar86 * fVar186;
  auVar28._0_4_ = fVar58 * fVar172;
  auVar28._8_4_ = fVar116 * fVar187;
  auVar28._12_4_ = fVar87 * fVar188;
  auVar28._16_4_ = fVar139 * 0.0;
  auVar28._20_4_ = fVar153 * 0.0;
  auVar28._24_4_ = fVar154 * 0.0;
  auVar28._28_4_ = auVar13._28_4_;
  auVar9 = vfnmadd231ps_fma(auVar28,local_b8,auVar84);
  fStack_15c = fStack_2ec + 0.0;
  auVar29._4_4_ = fStack_174 * fVar186;
  auVar29._0_4_ = local_178 * fVar172;
  auVar29._8_4_ = fStack_170 * fVar187;
  auVar29._12_4_ = fStack_16c * fVar188;
  auVar29._16_4_ = fStack_168 * fVar139;
  auVar29._20_4_ = fStack_164 * fVar153;
  auVar29._24_4_ = fStack_160 * fVar154;
  auVar29._28_4_ = 0;
  auVar12 = vfnmadd231ps_fma(auVar29,auVar84,local_3b8);
  auVar30._4_4_ = local_198._4_4_ * fVar186;
  auVar30._0_4_ = local_198._0_4_ * fVar172;
  auVar30._8_4_ = local_198._8_4_ * fVar187;
  auVar30._12_4_ = local_198._12_4_ * fVar188;
  auVar30._16_4_ = local_198._16_4_ * fVar139;
  auVar30._20_4_ = local_198._20_4_ * fVar153;
  auVar30._24_4_ = local_198._24_4_ * fVar154;
  auVar30._28_4_ = fStack_2ec + 0.0;
  auVar124 = vfnmadd231ps_fma(auVar30,local_d8,auVar84);
  auVar31._4_4_ = (float)local_528._4_4_ * fVar186;
  auVar31._0_4_ = (float)local_528._0_4_ * fVar172;
  auVar31._8_4_ = (float)uStack_520 * fVar187;
  auVar31._12_4_ = uStack_520._4_4_ * fVar188;
  auVar31._16_4_ = (float)uStack_518 * fVar139;
  auVar31._20_4_ = uStack_518._4_4_ * fVar153;
  auVar31._24_4_ = (float)uStack_510 * fVar154;
  auVar31._28_4_ = uStack_510._4_4_;
  auVar10 = vfnmadd231ps_fma(auVar31,local_348,auVar84);
  auVar198._0_4_ = fVar88 * fVar172;
  auVar198._4_4_ = fVar59 * fVar186;
  auVar198._8_4_ = fVar140 * fVar187;
  auVar198._12_4_ = fVar214 * fVar188;
  auVar198._16_4_ = fVar139 * 0.0;
  auVar198._20_4_ = fVar153 * 0.0;
  auVar198._24_4_ = fVar154 * 0.0;
  auVar198._28_4_ = 0;
  auVar11 = vfnmadd231ps_fma(auVar198,auVar240,auVar84);
  uStack_13c = 0x40400000;
  auVar32._4_4_ = fStack_154 * fVar186;
  auVar32._0_4_ = local_158 * fVar172;
  auVar32._8_4_ = fStack_150 * fVar187;
  auVar32._12_4_ = fStack_14c * fVar188;
  auVar32._16_4_ = fStack_148 * fVar139;
  auVar32._20_4_ = fStack_144 * fVar153;
  auVar32._24_4_ = fStack_140 * fVar154;
  auVar32._28_4_ = local_348._28_4_;
  auVar63 = vfnmadd231ps_fma(auVar32,local_118,auVar84);
  auVar33._4_4_ = local_138._4_4_ * fVar186;
  auVar33._0_4_ = local_138._0_4_ * fVar172;
  auVar33._8_4_ = local_138._8_4_ * fVar187;
  auVar33._12_4_ = local_138._12_4_ * fVar188;
  auVar33._16_4_ = local_138._16_4_ * fVar139;
  auVar33._20_4_ = local_138._20_4_ * fVar153;
  auVar33._24_4_ = local_138._24_4_ * fVar154;
  auVar33._28_4_ = local_138._28_4_;
  _local_308 = auVar16;
  auVar62 = vfnmadd231ps_fma(auVar33,auVar16,auVar84);
  auVar34._4_4_ = local_2a8._4_4_ * fVar186;
  auVar34._0_4_ = local_2a8._0_4_ * fVar172;
  auVar34._8_4_ = local_2a8._8_4_ * fVar187;
  auVar34._12_4_ = local_2a8._12_4_ * fVar188;
  auVar34._16_4_ = local_2a8._16_4_ * fVar139;
  auVar34._20_4_ = local_2a8._20_4_ * fVar153;
  auVar34._24_4_ = local_2a8._24_4_ * fVar154;
  auVar34._28_4_ = auVar83._28_4_ + auVar14._28_4_;
  auVar213 = ZEXT3264(_local_368);
  auVar227 = vfnmadd231ps_fma(auVar34,_local_368,auVar84);
  auVar13 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
  auVar83 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
  auVar14 = vminps_avx(ZEXT1632(auVar124),ZEXT1632(auVar10));
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(ZEXT1632(auVar124),ZEXT1632(auVar10));
  auVar83 = vmaxps_avx(auVar83,auVar13);
  auVar15 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar63));
  auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar63));
  auVar8 = vminps_avx(ZEXT1632(auVar62),ZEXT1632(auVar227));
  auVar15 = vminps_avx(auVar15,auVar8);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar62),ZEXT1632(auVar227));
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar83,auVar13);
  auVar46._4_4_ = fStack_74;
  auVar46._0_4_ = local_78;
  auVar46._8_4_ = fStack_70;
  auVar46._12_4_ = fStack_6c;
  auVar46._16_4_ = fStack_68;
  auVar46._20_4_ = fStack_64;
  auVar46._24_4_ = fStack_60;
  auVar46._28_4_ = fStack_5c;
  auVar83 = vcmpps_avx(auVar15,auVar46,2);
  auVar45._4_4_ = fStack_94;
  auVar45._0_4_ = local_98;
  auVar45._8_4_ = fStack_90;
  auVar45._12_4_ = fStack_8c;
  auVar45._16_4_ = fStack_88;
  auVar45._20_4_ = fStack_84;
  auVar45._24_4_ = fStack_80;
  auVar45._28_4_ = fStack_7c;
  auVar13 = vcmpps_avx(auVar13,auVar45,5);
  auVar83 = vandps_avx(auVar13,auVar83);
  auVar13 = local_1b8 & auVar83;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vsubps_avx(local_348,local_b8);
    auVar14 = vsubps_avx(_local_368,auVar240);
    fVar186 = auVar13._0_4_ + auVar14._0_4_;
    fVar187 = auVar13._4_4_ + auVar14._4_4_;
    fVar188 = auVar13._8_4_ + auVar14._8_4_;
    fVar139 = auVar13._12_4_ + auVar14._12_4_;
    fVar153 = auVar13._16_4_ + auVar14._16_4_;
    fVar154 = auVar13._20_4_ + auVar14._20_4_;
    fVar155 = auVar13._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(_local_528,local_f8);
    auVar8 = vsubps_avx(local_2a8,ZEXT1632(auVar234));
    auVar104._0_4_ = auVar15._0_4_ + auVar8._0_4_;
    auVar104._4_4_ = auVar15._4_4_ + auVar8._4_4_;
    auVar104._8_4_ = auVar15._8_4_ + auVar8._8_4_;
    auVar104._12_4_ = auVar15._12_4_ + auVar8._12_4_;
    auVar104._16_4_ = auVar15._16_4_ + auVar8._16_4_;
    auVar104._20_4_ = auVar15._20_4_ + auVar8._20_4_;
    auVar104._24_4_ = auVar15._24_4_ + auVar8._24_4_;
    fVar172 = auVar8._28_4_;
    auVar104._28_4_ = auVar15._28_4_ + fVar172;
    auVar35._4_4_ = fVar86 * fVar187;
    auVar35._0_4_ = fVar58 * fVar186;
    auVar35._8_4_ = fVar116 * fVar188;
    auVar35._12_4_ = fVar87 * fVar139;
    auVar35._16_4_ = fVar153 * 0.0;
    auVar35._20_4_ = fVar154 * 0.0;
    auVar35._24_4_ = fVar155 * 0.0;
    auVar35._28_4_ = local_2a8._28_4_;
    auVar11 = vfnmadd231ps_fma(auVar35,auVar104,local_b8);
    auVar36._4_4_ = fVar187 * fStack_174;
    auVar36._0_4_ = fVar186 * local_178;
    auVar36._8_4_ = fVar188 * fStack_170;
    auVar36._12_4_ = fVar139 * fStack_16c;
    auVar36._16_4_ = fVar153 * fStack_168;
    auVar36._20_4_ = fVar154 * fStack_164;
    auVar36._24_4_ = fVar155 * fStack_160;
    auVar36._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(local_3b8,auVar104,auVar36);
    auVar37._4_4_ = fVar187 * local_198._4_4_;
    auVar37._0_4_ = fVar186 * local_198._0_4_;
    auVar37._8_4_ = fVar188 * local_198._8_4_;
    auVar37._12_4_ = fVar139 * local_198._12_4_;
    auVar37._16_4_ = fVar153 * local_198._16_4_;
    auVar37._20_4_ = fVar154 * local_198._20_4_;
    auVar37._24_4_ = fVar155 * local_198._24_4_;
    auVar37._28_4_ = 0;
    auVar12 = vfnmadd213ps_fma(local_d8,auVar104,auVar37);
    auVar38._4_4_ = (float)local_528._4_4_ * fVar187;
    auVar38._0_4_ = (float)local_528._0_4_ * fVar186;
    auVar38._8_4_ = (float)uStack_520 * fVar188;
    auVar38._12_4_ = uStack_520._4_4_ * fVar139;
    auVar38._16_4_ = (float)uStack_518 * fVar153;
    auVar38._20_4_ = uStack_518._4_4_ * fVar154;
    auVar38._24_4_ = (float)uStack_510 * fVar155;
    auVar38._28_4_ = 0;
    auVar234 = vfnmadd231ps_fma(auVar38,auVar104,local_348);
    auVar128._0_4_ = fVar88 * fVar186;
    auVar128._4_4_ = fVar59 * fVar187;
    auVar128._8_4_ = fVar140 * fVar188;
    auVar128._12_4_ = fVar214 * fVar139;
    auVar128._16_4_ = fVar153 * 0.0;
    auVar128._20_4_ = fVar154 * 0.0;
    auVar128._24_4_ = fVar155 * 0.0;
    auVar128._28_4_ = 0;
    auVar63 = vfnmadd231ps_fma(auVar128,auVar104,auVar240);
    auVar39._4_4_ = fVar187 * fStack_154;
    auVar39._0_4_ = fVar186 * local_158;
    auVar39._8_4_ = fVar188 * fStack_150;
    auVar39._12_4_ = fVar139 * fStack_14c;
    auVar39._16_4_ = fVar153 * fStack_148;
    auVar39._20_4_ = fVar154 * fStack_144;
    auVar39._24_4_ = fVar155 * fStack_140;
    auVar39._28_4_ = fVar172;
    auVar124 = vfnmadd213ps_fma(local_118,auVar104,auVar39);
    auVar40._4_4_ = fVar187 * local_138._4_4_;
    auVar40._0_4_ = fVar186 * local_138._0_4_;
    auVar40._8_4_ = fVar188 * local_138._8_4_;
    auVar40._12_4_ = fVar139 * local_138._12_4_;
    auVar40._16_4_ = fVar153 * local_138._16_4_;
    auVar40._20_4_ = fVar154 * local_138._20_4_;
    auVar40._24_4_ = fVar155 * local_138._24_4_;
    auVar40._28_4_ = fVar172;
    auVar10 = vfnmadd213ps_fma(auVar16,auVar104,auVar40);
    auVar213 = ZEXT1664(auVar10);
    auVar41._4_4_ = fVar187 * local_2a8._4_4_;
    auVar41._0_4_ = fVar186 * local_2a8._0_4_;
    auVar41._8_4_ = fVar188 * local_2a8._8_4_;
    auVar41._12_4_ = fVar139 * local_2a8._12_4_;
    auVar41._16_4_ = fVar153 * local_2a8._16_4_;
    auVar41._20_4_ = fVar154 * local_2a8._20_4_;
    auVar41._24_4_ = fVar155 * local_2a8._24_4_;
    auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
    auVar62 = vfnmadd231ps_fma(auVar41,auVar104,_local_368);
    auVar14 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar9));
    auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar9));
    auVar15 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar234));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar234));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar8 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar124));
    auVar14 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar124));
    auVar16 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar62));
    auVar8 = vminps_avx(auVar8,auVar16);
    auVar8 = vminps_avx(auVar15,auVar8);
    auVar15 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar62));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vcmpps_avx(auVar8,auVar46,2);
    auVar14 = vcmpps_avx(auVar14,auVar45,5);
    auVar13 = vandps_avx(auVar14,auVar13);
    auVar83 = vandps_avx(auVar83,local_1b8);
    auVar14 = auVar83 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar83 = vandps_avx(auVar13,auVar83);
      uVar56 = vmovmskps_avx(auVar83);
      if (uVar56 != 0) {
        auStack_2e8[uVar54] = uVar56 & 0xff;
        uVar89 = vmovlps_avx(local_238);
        *(undefined8 *)(&uStack_1d8 + uVar54 * 2) = uVar89;
        uVar55 = vmovlps_avx(local_538);
        auStack_58[uVar54] = uVar55;
        uVar54 = (ulong)((int)uVar54 + 1);
      }
    }
  }
LAB_01157939:
  _local_528 = auVar18;
  if ((int)uVar54 == 0) {
    fVar58 = (ray->super_RayK<1>).tfar;
    auVar82._4_4_ = fVar58;
    auVar82._0_4_ = fVar58;
    auVar82._8_4_ = fVar58;
    auVar82._12_4_ = fVar58;
    auVar9 = vcmpps_avx(local_288,auVar82,2);
    uVar48 = vmovmskps_avx(auVar9);
    uVar49 = (ulong)((uint)uVar49 & (uint)local_4d0 & uVar48);
    prim = local_4c8;
    goto LAB_01156c8e;
  }
  uVar47 = (int)uVar54 - 1;
  uVar50 = (ulong)uVar47;
  uVar53 = auStack_2e8[uVar50];
  uVar56 = (&uStack_1d8)[uVar50 * 2];
  fVar58 = afStack_1d4[uVar50 * 2];
  iVar17 = 0;
  for (uVar55 = (ulong)uVar53; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    iVar17 = iVar17 + 1;
  }
  uVar53 = uVar53 - 1 & uVar53;
  if (uVar53 == 0) {
    uVar54 = (ulong)uVar47;
  }
  local_538._8_8_ = 0;
  local_538._0_8_ = auStack_58[uVar50];
  auStack_2e8[uVar50] = uVar53;
  fVar86 = (float)(iVar17 + 1) * 0.14285715;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * (float)iVar17 * 0.14285715)),ZEXT416(uVar56),
                           ZEXT416((uint)(1.0 - (float)iVar17 * 0.14285715)));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * fVar86)),ZEXT416(uVar56),
                            ZEXT416((uint)(1.0 - fVar86)));
  fVar86 = auVar12._0_4_;
  auVar185._0_4_ = auVar9._0_4_;
  fVar58 = fVar86 - auVar185._0_4_;
  if (fVar58 < 0.16666667) {
    auVar124 = vshufps_avx(local_538,local_538,0x50);
    auVar93._8_4_ = 0x3f800000;
    auVar93._0_8_ = 0x3f8000003f800000;
    auVar93._12_4_ = 0x3f800000;
    auVar10 = vsubps_avx(auVar93,auVar124);
    fVar116 = auVar124._0_4_;
    auVar134._0_4_ = fVar116 * (float)local_408._0_4_;
    fVar87 = auVar124._4_4_;
    auVar134._4_4_ = fVar87 * (float)local_408._4_4_;
    fVar88 = auVar124._8_4_;
    auVar134._8_4_ = fVar88 * fStack_400;
    fVar59 = auVar124._12_4_;
    auVar134._12_4_ = fVar59 * fStack_3fc;
    auVar143._0_4_ = fVar116 * (float)local_418._0_4_;
    auVar143._4_4_ = fVar87 * (float)local_418._4_4_;
    auVar143._8_4_ = fVar88 * fStack_410;
    auVar143._12_4_ = fVar59 * fStack_40c;
    auVar168._0_4_ = fVar116 * (float)local_428._0_4_;
    auVar168._4_4_ = fVar87 * (float)local_428._4_4_;
    auVar168._8_4_ = fVar88 * fStack_420;
    auVar168._12_4_ = fVar59 * fStack_41c;
    auVar72._0_4_ = fVar116 * (float)local_438._0_4_;
    auVar72._4_4_ = fVar87 * (float)local_438._4_4_;
    auVar72._8_4_ = fVar88 * fStack_430;
    auVar72._12_4_ = fVar59 * fStack_42c;
    auVar124 = vfmadd231ps_fma(auVar134,auVar10,local_3c8);
    auVar11 = vfmadd231ps_fma(auVar143,auVar10,local_3d8);
    auVar234 = vfmadd231ps_fma(auVar168,auVar10,local_3e8);
    auVar10 = vfmadd231ps_fma(auVar72,auVar10,local_3f8);
    auVar129._16_16_ = auVar124;
    auVar129._0_16_ = auVar124;
    auVar138._16_16_ = auVar11;
    auVar138._0_16_ = auVar11;
    auVar152._16_16_ = auVar234;
    auVar152._0_16_ = auVar234;
    _local_528 = auVar9;
    auVar185._4_4_ = auVar185._0_4_;
    auVar185._8_4_ = auVar185._0_4_;
    auVar185._12_4_ = auVar185._0_4_;
    local_3b8._0_16_ = auVar12;
    auVar185._20_4_ = fVar86;
    auVar185._16_4_ = fVar86;
    auVar185._24_4_ = fVar86;
    auVar185._28_4_ = fVar86;
    auVar83 = vsubps_avx(auVar138,auVar129);
    auVar11 = vfmadd213ps_fma(auVar83,auVar185,auVar129);
    auVar83 = vsubps_avx(auVar152,auVar138);
    auVar63 = vfmadd213ps_fma(auVar83,auVar185,auVar138);
    auVar124 = vsubps_avx(auVar10,auVar234);
    auVar85._16_16_ = auVar124;
    auVar85._0_16_ = auVar124;
    auVar124 = vfmadd213ps_fma(auVar85,auVar185,auVar152);
    auVar83 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar11));
    auVar10 = vfmadd213ps_fma(auVar83,auVar185,ZEXT1632(auVar11));
    auVar83 = vsubps_avx(ZEXT1632(auVar124),ZEXT1632(auVar63));
    auVar124 = vfmadd213ps_fma(auVar83,auVar185,ZEXT1632(auVar63));
    auVar83 = vsubps_avx(ZEXT1632(auVar124),ZEXT1632(auVar10));
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar83,auVar185);
    fVar214 = auVar83._4_4_ * 3.0;
    local_348._0_4_ = fVar58;
    fVar116 = fVar58 * 0.33333334;
    local_2a8._0_8_ =
         CONCAT44(auVar105._4_4_ + fVar116 * fVar214,auVar105._0_4_ + fVar116 * auVar83._0_4_ * 3.0)
    ;
    local_2a8._8_4_ = auVar105._8_4_ + fVar116 * auVar83._8_4_ * 3.0;
    local_2a8._12_4_ = auVar105._12_4_ + fVar116 * auVar83._12_4_ * 3.0;
    auVar10 = vshufpd_avx(auVar105,auVar105,3);
    auVar11 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    _local_368 = auVar10;
    auVar124 = vsubps_avx(auVar10,auVar105);
    auVar234 = vsubps_avx(auVar11,(undefined1  [16])0x0);
    auVar73._0_4_ = auVar124._0_4_ + auVar234._0_4_;
    auVar73._4_4_ = auVar124._4_4_ + auVar234._4_4_;
    auVar73._8_4_ = auVar124._8_4_ + auVar234._8_4_;
    auVar73._12_4_ = auVar124._12_4_ + auVar234._12_4_;
    auVar124 = vshufps_avx(auVar105,auVar105,0xb1);
    auVar234 = vshufps_avx(local_2a8._0_16_,local_2a8._0_16_,0xb1);
    auVar253._4_4_ = auVar73._0_4_;
    auVar253._0_4_ = auVar73._0_4_;
    auVar253._8_4_ = auVar73._0_4_;
    auVar253._12_4_ = auVar73._0_4_;
    auVar63 = vshufps_avx(auVar73,auVar73,0x55);
    fVar87 = auVar63._0_4_;
    auVar74._0_4_ = fVar87 * auVar124._0_4_;
    fVar88 = auVar63._4_4_;
    auVar74._4_4_ = fVar88 * auVar124._4_4_;
    fVar59 = auVar63._8_4_;
    auVar74._8_4_ = fVar59 * auVar124._8_4_;
    fVar140 = auVar63._12_4_;
    auVar74._12_4_ = fVar140 * auVar124._12_4_;
    auVar144._0_4_ = fVar87 * auVar234._0_4_;
    auVar144._4_4_ = fVar88 * auVar234._4_4_;
    auVar144._8_4_ = fVar59 * auVar234._8_4_;
    auVar144._12_4_ = fVar140 * auVar234._12_4_;
    auVar62 = vfmadd231ps_fma(auVar74,auVar253,auVar105);
    auVar227 = vfmadd231ps_fma(auVar144,auVar253,local_2a8._0_16_);
    auVar234 = vshufps_avx(auVar62,auVar62,0xe8);
    auVar63 = vshufps_avx(auVar227,auVar227,0xe8);
    auVar124 = vcmpps_avx(auVar234,auVar63,1);
    uVar56 = vextractps_avx(auVar124,0);
    auVar61 = auVar227;
    if ((uVar56 & 1) == 0) {
      auVar61 = auVar62;
    }
    auVar120._0_4_ = fVar116 * auVar83._16_4_ * 3.0;
    auVar120._4_4_ = fVar116 * fVar214;
    auVar120._8_4_ = fVar116 * auVar83._24_4_ * 3.0;
    auVar120._12_4_ = fVar116 * auVar213._28_4_;
    auVar60 = vsubps_avx((undefined1  [16])0x0,auVar120);
    auVar121 = vshufps_avx(auVar60,auVar60,0xb1);
    auVar117 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar178._0_4_ = fVar87 * auVar121._0_4_;
    auVar178._4_4_ = fVar88 * auVar121._4_4_;
    auVar178._8_4_ = fVar59 * auVar121._8_4_;
    auVar178._12_4_ = fVar140 * auVar121._12_4_;
    auVar194._0_4_ = auVar117._0_4_ * fVar87;
    auVar194._4_4_ = auVar117._4_4_ * fVar88;
    auVar194._8_4_ = auVar117._8_4_ * fVar59;
    auVar194._12_4_ = auVar117._12_4_ * fVar140;
    _local_308 = auVar60;
    auVar90 = vfmadd231ps_fma(auVar178,auVar253,auVar60);
    auVar141 = vfmadd231ps_fma(auVar194,(undefined1  [16])0x0,auVar253);
    auVar117 = vshufps_avx(auVar90,auVar90,0xe8);
    auVar130 = vshufps_avx(auVar141,auVar141,0xe8);
    auVar213 = ZEXT1664(auVar130);
    auVar121 = vcmpps_avx(auVar117,auVar130,1);
    uVar56 = vextractps_avx(auVar121,0);
    auVar156 = auVar141;
    if ((uVar56 & 1) == 0) {
      auVar156 = auVar90;
    }
    auVar61 = vmaxss_avx(auVar156,auVar61);
    auVar234 = vminps_avx(auVar234,auVar63);
    auVar63 = vminps_avx(auVar117,auVar130);
    auVar63 = vminps_avx(auVar234,auVar63);
    auVar124 = vshufps_avx(auVar124,auVar124,0x55);
    auVar124 = vblendps_avx(auVar124,auVar121,2);
    auVar121 = vpslld_avx(auVar124,0x1f);
    auVar124 = vshufpd_avx(auVar227,auVar227,1);
    auVar124 = vinsertps_avx(auVar124,auVar141,0x9c);
    auVar234 = vshufpd_avx(auVar62,auVar62,1);
    auVar234 = vinsertps_avx(auVar234,auVar90,0x9c);
    auVar124 = vblendvps_avx(auVar234,auVar124,auVar121);
    auVar234 = vmovshdup_avx(auVar124);
    auVar124 = vmaxss_avx(auVar234,auVar124);
    fVar59 = auVar63._0_4_;
    auVar234 = vmovshdup_avx(auVar63);
    fVar88 = auVar124._0_4_;
    fVar116 = auVar234._0_4_;
    fVar87 = auVar61._0_4_;
    auVar18 = _local_528;
    if (((0.0001 <= fVar59) || (fVar88 <= -0.0001)) && (0.0001 <= fVar116 || fVar88 <= -0.0001))
    goto code_r0x01157c44;
    goto LAB_01157c6a;
  }
  local_238 = vinsertps_avx(auVar9,auVar12,0x10);
  goto LAB_01157388;
code_r0x01157c44:
  auVar234 = vcmpps_avx(auVar234,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar62 = vcmpps_avx(auVar63,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar234 = vandps_avx(auVar62,auVar234);
  if (fVar87 <= -0.0001 || (auVar234 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01157939;
LAB_01157c6a:
  auVar62 = vcmpps_avx(auVar63,_DAT_01f45a50,1);
  auVar227 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar234 = vcmpss_avx(auVar61,ZEXT816(0) << 0x20,1);
  auVar94._8_4_ = 0x3f800000;
  auVar94._0_8_ = 0x3f8000003f800000;
  auVar94._12_4_ = 0x3f800000;
  auVar108._8_4_ = 0xbf800000;
  auVar108._0_8_ = 0xbf800000bf800000;
  auVar108._12_4_ = 0xbf800000;
  auVar234 = vblendvps_avx(auVar94,auVar108,auVar234);
  auVar62 = vblendvps_avx(auVar94,auVar108,auVar62);
  fVar214 = auVar62._0_4_;
  fVar140 = auVar234._0_4_;
  auVar234 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar214 == fVar140) && (!NAN(fVar214) && !NAN(fVar140))) {
    auVar234 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar214 == fVar140) && (!NAN(fVar214) && !NAN(fVar140))) {
    auVar227 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar62 = vmovshdup_avx(auVar62);
  fVar172 = auVar62._0_4_;
  if ((fVar214 != fVar172) || (NAN(fVar214) || NAN(fVar172))) {
    if ((fVar116 != fVar59) || (NAN(fVar116) || NAN(fVar59))) {
      auVar122._0_4_ = (float)((uint)fVar59 ^ local_328);
      auVar122._4_4_ = auVar63._4_4_ ^ uStack_324;
      auVar122._8_4_ = auVar63._8_4_ ^ uStack_320;
      auVar122._12_4_ = auVar63._12_4_ ^ uStack_31c;
      auVar123._0_4_ = auVar122._0_4_ / (fVar116 - fVar59);
      auVar123._4_12_ = auVar122._4_12_;
      auVar63 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar123._0_4_)),auVar123,ZEXT416(0));
      auVar62 = auVar63;
    }
    else {
      auVar63 = ZEXT816(0) << 0x20;
      if ((fVar59 != 0.0) || (auVar62 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar59))) {
        auVar63 = SUB6416(ZEXT464(0x7f800000),0);
        auVar62 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar234 = vminss_avx(auVar234,auVar63);
    auVar227 = vmaxss_avx(auVar62,auVar227);
  }
  auVar124 = vcmpss_avx(auVar124,ZEXT416(0),1);
  auVar95._8_4_ = 0x3f800000;
  auVar95._0_8_ = 0x3f8000003f800000;
  auVar95._12_4_ = 0x3f800000;
  auVar109._8_4_ = 0xbf800000;
  auVar109._0_8_ = 0xbf800000bf800000;
  auVar109._12_4_ = 0xbf800000;
  auVar124 = vblendvps_avx(auVar95,auVar109,auVar124);
  fVar116 = auVar124._0_4_;
  if ((fVar140 != fVar116) || (NAN(fVar140) || NAN(fVar116))) {
    if ((fVar88 != fVar87) || (NAN(fVar88) || NAN(fVar87))) {
      auVar75._0_4_ = (float)((uint)fVar87 ^ local_328);
      auVar75._4_4_ = auVar61._4_4_ ^ uStack_324;
      auVar75._8_4_ = auVar61._8_4_ ^ uStack_320;
      auVar75._12_4_ = auVar61._12_4_ ^ uStack_31c;
      auVar125._0_4_ = auVar75._0_4_ / (fVar88 - fVar87);
      auVar125._4_12_ = auVar75._4_12_;
      auVar124 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar125._0_4_)),auVar125,ZEXT416(0));
      auVar63 = auVar124;
    }
    else {
      auVar124 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar87 != 0.0) || (auVar63 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar87))) {
        auVar124 = SUB6416(ZEXT464(0xff800000),0);
        auVar63 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar234 = vminss_avx(auVar234,auVar63);
    auVar227 = vmaxss_avx(auVar124,auVar227);
  }
  if ((fVar172 != fVar116) || (NAN(fVar172) || NAN(fVar116))) {
    auVar234 = vminss_avx(auVar234,SUB6416(ZEXT464(0x3f800000),0));
    auVar227 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar227);
  }
  auVar124 = vmaxss_avx(ZEXT816(0) << 0x40,auVar234);
  auVar234 = vminss_avx(auVar227,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar234._0_4_ < auVar124._0_4_) goto LAB_01157939;
  auVar124 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar124._0_4_ + -0.1)));
  auVar234 = vminss_avx(ZEXT416((uint)(auVar234._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar135._0_8_ = auVar105._0_8_;
  auVar135._8_8_ = auVar135._0_8_;
  auVar205._8_8_ = local_2a8._0_8_;
  auVar205._0_8_ = local_2a8._0_8_;
  auVar217._8_8_ = auVar60._0_8_;
  auVar217._0_8_ = auVar60._0_8_;
  auVar63 = vshufpd_avx(local_2a8._0_16_,local_2a8._0_16_,3);
  auVar62 = vshufpd_avx(auVar60,auVar60,3);
  auVar227 = vshufps_avx(auVar124,auVar234,0);
  auVar76._8_4_ = 0x3f800000;
  auVar76._0_8_ = 0x3f8000003f800000;
  auVar76._12_4_ = 0x3f800000;
  auVar105 = vsubps_avx(auVar76,auVar227);
  local_368._0_4_ = auVar10._0_4_;
  local_368._4_4_ = auVar10._4_4_;
  fStack_360 = auVar10._8_4_;
  fStack_35c = auVar10._12_4_;
  fVar116 = auVar227._0_4_;
  auVar77._0_4_ = fVar116 * (float)local_368._0_4_;
  fVar87 = auVar227._4_4_;
  auVar77._4_4_ = fVar87 * (float)local_368._4_4_;
  fVar88 = auVar227._8_4_;
  auVar77._8_4_ = fVar88 * fStack_360;
  fVar59 = auVar227._12_4_;
  auVar77._12_4_ = fVar59 * fStack_35c;
  auVar169._0_4_ = fVar116 * auVar63._0_4_;
  auVar169._4_4_ = fVar87 * auVar63._4_4_;
  auVar169._8_4_ = fVar88 * auVar63._8_4_;
  auVar169._12_4_ = fVar59 * auVar63._12_4_;
  auVar179._0_4_ = fVar116 * auVar62._0_4_;
  auVar179._4_4_ = fVar87 * auVar62._4_4_;
  auVar179._8_4_ = fVar88 * auVar62._8_4_;
  auVar179._12_4_ = fVar59 * auVar62._12_4_;
  auVar195._0_4_ = fVar116 * auVar11._0_4_;
  auVar195._4_4_ = fVar87 * auVar11._4_4_;
  auVar195._8_4_ = fVar88 * auVar11._8_4_;
  auVar195._12_4_ = fVar59 * auVar11._12_4_;
  auVar63 = vfmadd231ps_fma(auVar77,auVar105,auVar135);
  auVar62 = vfmadd231ps_fma(auVar169,auVar105,auVar205);
  auVar227 = vfmadd231ps_fma(auVar179,auVar105,auVar217);
  auVar105 = vfmadd231ps_fma(auVar195,auVar105,ZEXT816(0));
  auVar10 = vmovshdup_avx(local_538);
  auVar60 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar124._0_4_)),local_538,
                            ZEXT416((uint)(1.0 - auVar124._0_4_)));
  local_538 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar234._0_4_)),local_538,
                              ZEXT416((uint)(1.0 - auVar234._0_4_)));
  fVar116 = 1.0 / fVar58;
  auVar124 = vsubps_avx(auVar62,auVar63);
  auVar206._0_4_ = auVar124._0_4_ * 3.0;
  auVar206._4_4_ = auVar124._4_4_ * 3.0;
  auVar206._8_4_ = auVar124._8_4_ * 3.0;
  auVar206._12_4_ = auVar124._12_4_ * 3.0;
  auVar124 = vsubps_avx(auVar227,auVar62);
  auVar218._0_4_ = auVar124._0_4_ * 3.0;
  auVar218._4_4_ = auVar124._4_4_ * 3.0;
  auVar218._8_4_ = auVar124._8_4_ * 3.0;
  auVar218._12_4_ = auVar124._12_4_ * 3.0;
  auVar124 = vsubps_avx(auVar105,auVar227);
  auVar228._0_4_ = auVar124._0_4_ * 3.0;
  auVar228._4_4_ = auVar124._4_4_ * 3.0;
  auVar228._8_4_ = auVar124._8_4_ * 3.0;
  auVar228._12_4_ = auVar124._12_4_ * 3.0;
  auVar10 = vminps_avx(auVar218,auVar228);
  auVar124 = vmaxps_avx(auVar218,auVar228);
  auVar10 = vminps_avx(auVar206,auVar10);
  auVar124 = vmaxps_avx(auVar206,auVar124);
  auVar11 = vshufpd_avx(auVar10,auVar10,3);
  auVar234 = vshufpd_avx(auVar124,auVar124,3);
  auVar10 = vminps_avx(auVar10,auVar11);
  auVar124 = vmaxps_avx(auVar124,auVar234);
  auVar219._0_4_ = auVar10._0_4_ * fVar116;
  auVar219._4_4_ = auVar10._4_4_ * fVar116;
  auVar219._8_4_ = auVar10._8_4_ * fVar116;
  auVar219._12_4_ = auVar10._12_4_ * fVar116;
  auVar207._0_4_ = auVar124._0_4_ * fVar116;
  auVar207._4_4_ = auVar124._4_4_ * fVar116;
  auVar207._8_4_ = auVar124._8_4_ * fVar116;
  auVar207._12_4_ = auVar124._12_4_ * fVar116;
  fVar116 = 1.0 / (local_538._0_4_ - auVar60._0_4_);
  auVar124 = vshufpd_avx(auVar63,auVar63,3);
  auVar10 = vshufpd_avx(auVar62,auVar62,3);
  auVar11 = vshufpd_avx(auVar227,auVar227,3);
  auVar234 = vshufpd_avx(auVar105,auVar105,3);
  auVar124 = vsubps_avx(auVar124,auVar63);
  auVar63 = vsubps_avx(auVar10,auVar62);
  auVar62 = vsubps_avx(auVar11,auVar227);
  auVar234 = vsubps_avx(auVar234,auVar105);
  auVar10 = vminps_avx(auVar124,auVar63);
  auVar124 = vmaxps_avx(auVar124,auVar63);
  auVar11 = vminps_avx(auVar62,auVar234);
  auVar11 = vminps_avx(auVar10,auVar11);
  auVar10 = vmaxps_avx(auVar62,auVar234);
  auVar124 = vmaxps_avx(auVar124,auVar10);
  auVar245._0_4_ = fVar116 * auVar11._0_4_;
  auVar245._4_4_ = fVar116 * auVar11._4_4_;
  auVar245._8_4_ = fVar116 * auVar11._8_4_;
  auVar245._12_4_ = fVar116 * auVar11._12_4_;
  auVar235._0_4_ = fVar116 * auVar124._0_4_;
  auVar235._4_4_ = fVar116 * auVar124._4_4_;
  auVar235._8_4_ = fVar116 * auVar124._8_4_;
  auVar235._12_4_ = fVar116 * auVar124._12_4_;
  auVar234 = vinsertps_avx(auVar9,auVar60,0x10);
  auVar63 = vinsertps_avx(auVar12,local_538,0x10);
  auVar229._0_4_ = (auVar234._0_4_ + auVar63._0_4_) * 0.5;
  auVar229._4_4_ = (auVar234._4_4_ + auVar63._4_4_) * 0.5;
  auVar229._8_4_ = (auVar234._8_4_ + auVar63._8_4_) * 0.5;
  auVar229._12_4_ = (auVar234._12_4_ + auVar63._12_4_) * 0.5;
  auVar78._4_4_ = auVar229._0_4_;
  auVar78._0_4_ = auVar229._0_4_;
  auVar78._8_4_ = auVar229._0_4_;
  auVar78._12_4_ = auVar229._0_4_;
  auVar124 = vfmadd213ps_fma(local_1e8,auVar78,local_4e8);
  auVar10 = vfmadd213ps_fma(local_1f8,auVar78,local_4f8);
  auVar11 = vfmadd213ps_fma(local_208,auVar78,local_508);
  auVar12 = vsubps_avx(auVar10,auVar124);
  auVar124 = vfmadd213ps_fma(auVar12,auVar78,auVar124);
  auVar12 = vsubps_avx(auVar11,auVar10);
  auVar12 = vfmadd213ps_fma(auVar12,auVar78,auVar10);
  auVar12 = vsubps_avx(auVar12,auVar124);
  auVar124 = vfmadd231ps_fma(auVar124,auVar12,auVar78);
  auVar79._0_8_ = CONCAT44(auVar12._4_4_ * 3.0,auVar12._0_4_ * 3.0);
  auVar79._8_4_ = auVar12._8_4_ * 3.0;
  auVar79._12_4_ = auVar12._12_4_ * 3.0;
  auVar254._8_8_ = auVar124._0_8_;
  auVar254._0_8_ = auVar124._0_8_;
  auVar12 = vshufpd_avx(auVar124,auVar124,3);
  auVar124 = vshufps_avx(auVar229,auVar229,0x55);
  auVar227 = vsubps_avx(auVar12,auVar254);
  auVar61 = vfmadd231ps_fma(auVar254,auVar124,auVar227);
  auVar259._8_8_ = auVar79._0_8_;
  auVar259._0_8_ = auVar79._0_8_;
  auVar12 = vshufpd_avx(auVar79,auVar79,3);
  auVar12 = vsubps_avx(auVar12,auVar259);
  auVar105 = vfmadd213ps_fma(auVar12,auVar124,auVar259);
  auVar124 = vmovshdup_avx(auVar105);
  auVar260._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
  auVar260._8_4_ = auVar124._8_4_ ^ 0x80000000;
  auVar260._12_4_ = auVar124._12_4_ ^ 0x80000000;
  auVar10 = vmovshdup_avx(auVar227);
  auVar12 = vunpcklps_avx(auVar10,auVar260);
  auVar11 = vshufps_avx(auVar12,auVar260,4);
  auVar62 = vshufps_avx(auVar229,auVar229,0x54);
  auVar126._0_8_ = auVar227._0_8_ ^ 0x8000000080000000;
  auVar126._8_4_ = auVar227._8_4_ ^ 0x80000000;
  auVar126._12_4_ = auVar227._12_4_ ^ 0x80000000;
  auVar12 = vmovlhps_avx(auVar126,auVar105);
  auVar12 = vshufps_avx(auVar12,auVar105,8);
  auVar124 = vfmsub231ss_fma(ZEXT416((uint)(auVar227._0_4_ * auVar124._0_4_)),auVar10,auVar105);
  uVar57 = auVar124._0_4_;
  auVar80._4_4_ = uVar57;
  auVar80._0_4_ = uVar57;
  auVar80._8_4_ = uVar57;
  auVar80._12_4_ = uVar57;
  auVar124 = vdivps_avx(auVar11,auVar80);
  auVar10 = vdivps_avx(auVar12,auVar80);
  fVar88 = auVar61._0_4_;
  fVar116 = auVar124._0_4_;
  auVar12 = vshufps_avx(auVar61,auVar61,0x55);
  fVar87 = auVar10._0_4_;
  auVar81._0_4_ = fVar88 * fVar116 + auVar12._0_4_ * fVar87;
  auVar81._4_4_ = fVar88 * auVar124._4_4_ + auVar12._4_4_ * auVar10._4_4_;
  auVar81._8_4_ = fVar88 * auVar124._8_4_ + auVar12._8_4_ * auVar10._8_4_;
  auVar81._12_4_ = fVar88 * auVar124._12_4_ + auVar12._12_4_ * auVar10._12_4_;
  auVar130 = vsubps_avx(auVar62,auVar81);
  auVar62 = vmovshdup_avx(auVar124);
  auVar12 = vinsertps_avx(auVar219,auVar245,0x1c);
  auVar145._0_4_ = auVar62._0_4_ * auVar12._0_4_;
  auVar145._4_4_ = auVar62._4_4_ * auVar12._4_4_;
  auVar145._8_4_ = auVar62._8_4_ * auVar12._8_4_;
  auVar145._12_4_ = auVar62._12_4_ * auVar12._12_4_;
  auVar11 = vinsertps_avx(auVar207,auVar235,0x1c);
  auVar96._0_4_ = auVar11._0_4_ * auVar62._0_4_;
  auVar96._4_4_ = auVar11._4_4_ * auVar62._4_4_;
  auVar96._8_4_ = auVar11._8_4_ * auVar62._8_4_;
  auVar96._12_4_ = auVar11._12_4_ * auVar62._12_4_;
  auVar61 = vminps_avx(auVar145,auVar96);
  auVar105 = vmaxps_avx(auVar96,auVar145);
  auVar62 = vinsertps_avx(auVar245,auVar219,0x4c);
  auVar121 = vmovshdup_avx(auVar10);
  auVar227 = vinsertps_avx(auVar235,auVar207,0x4c);
  auVar236._0_4_ = auVar121._0_4_ * auVar62._0_4_;
  auVar236._4_4_ = auVar121._4_4_ * auVar62._4_4_;
  auVar236._8_4_ = auVar121._8_4_ * auVar62._8_4_;
  auVar236._12_4_ = auVar121._12_4_ * auVar62._12_4_;
  auVar220._0_4_ = auVar121._0_4_ * auVar227._0_4_;
  auVar220._4_4_ = auVar121._4_4_ * auVar227._4_4_;
  auVar220._8_4_ = auVar121._8_4_ * auVar227._8_4_;
  auVar220._12_4_ = auVar121._12_4_ * auVar227._12_4_;
  auVar121 = vminps_avx(auVar236,auVar220);
  auVar246._0_4_ = auVar61._0_4_ + auVar121._0_4_;
  auVar246._4_4_ = auVar61._4_4_ + auVar121._4_4_;
  auVar246._8_4_ = auVar61._8_4_ + auVar121._8_4_;
  auVar246._12_4_ = auVar61._12_4_ + auVar121._12_4_;
  auVar61 = vmaxps_avx(auVar220,auVar236);
  auVar97._0_4_ = auVar61._0_4_ + auVar105._0_4_;
  auVar97._4_4_ = auVar61._4_4_ + auVar105._4_4_;
  auVar97._8_4_ = auVar61._8_4_ + auVar105._8_4_;
  auVar97._12_4_ = auVar61._12_4_ + auVar105._12_4_;
  auVar221._8_8_ = 0x3f80000000000000;
  auVar221._0_8_ = 0x3f80000000000000;
  auVar105 = vsubps_avx(auVar221,auVar97);
  auVar61 = vsubps_avx(auVar221,auVar246);
  auVar121 = vsubps_avx(auVar234,auVar229);
  auVar117 = vsubps_avx(auVar63,auVar229);
  auVar110._0_4_ = fVar116 * auVar12._0_4_;
  auVar110._4_4_ = fVar116 * auVar12._4_4_;
  auVar110._8_4_ = fVar116 * auVar12._8_4_;
  auVar110._12_4_ = fVar116 * auVar12._12_4_;
  auVar247._0_4_ = fVar116 * auVar11._0_4_;
  auVar247._4_4_ = fVar116 * auVar11._4_4_;
  auVar247._8_4_ = fVar116 * auVar11._8_4_;
  auVar247._12_4_ = fVar116 * auVar11._12_4_;
  auVar11 = vminps_avx(auVar110,auVar247);
  auVar12 = vmaxps_avx(auVar247,auVar110);
  auVar146._0_4_ = fVar87 * auVar62._0_4_;
  auVar146._4_4_ = fVar87 * auVar62._4_4_;
  auVar146._8_4_ = fVar87 * auVar62._8_4_;
  auVar146._12_4_ = fVar87 * auVar62._12_4_;
  auVar208._0_4_ = fVar87 * auVar227._0_4_;
  auVar208._4_4_ = fVar87 * auVar227._4_4_;
  auVar208._8_4_ = fVar87 * auVar227._8_4_;
  auVar208._12_4_ = fVar87 * auVar227._12_4_;
  auVar62 = vminps_avx(auVar146,auVar208);
  auVar248._0_4_ = auVar11._0_4_ + auVar62._0_4_;
  auVar248._4_4_ = auVar11._4_4_ + auVar62._4_4_;
  auVar248._8_4_ = auVar11._8_4_ + auVar62._8_4_;
  auVar248._12_4_ = auVar11._12_4_ + auVar62._12_4_;
  fVar172 = auVar121._0_4_;
  auVar255._0_4_ = fVar172 * auVar105._0_4_;
  fVar186 = auVar121._4_4_;
  auVar255._4_4_ = fVar186 * auVar105._4_4_;
  fVar187 = auVar121._8_4_;
  auVar255._8_4_ = fVar187 * auVar105._8_4_;
  fVar188 = auVar121._12_4_;
  auVar255._12_4_ = fVar188 * auVar105._12_4_;
  auVar11 = vmaxps_avx(auVar208,auVar146);
  auVar209._0_4_ = fVar172 * auVar61._0_4_;
  auVar209._4_4_ = fVar186 * auVar61._4_4_;
  auVar209._8_4_ = fVar187 * auVar61._8_4_;
  auVar209._12_4_ = fVar188 * auVar61._12_4_;
  fVar88 = auVar117._0_4_;
  auVar98._0_4_ = fVar88 * auVar105._0_4_;
  fVar59 = auVar117._4_4_;
  auVar98._4_4_ = fVar59 * auVar105._4_4_;
  fVar140 = auVar117._8_4_;
  auVar98._8_4_ = fVar140 * auVar105._8_4_;
  fVar214 = auVar117._12_4_;
  auVar98._12_4_ = fVar214 * auVar105._12_4_;
  auVar222._0_4_ = fVar88 * auVar61._0_4_;
  auVar222._4_4_ = fVar59 * auVar61._4_4_;
  auVar222._8_4_ = fVar140 * auVar61._8_4_;
  auVar222._12_4_ = fVar214 * auVar61._12_4_;
  auVar111._0_4_ = auVar12._0_4_ + auVar11._0_4_;
  auVar111._4_4_ = auVar12._4_4_ + auVar11._4_4_;
  auVar111._8_4_ = auVar12._8_4_ + auVar11._8_4_;
  auVar111._12_4_ = auVar12._12_4_ + auVar11._12_4_;
  auVar147._8_8_ = 0x3f800000;
  auVar147._0_8_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar147,auVar111);
  auVar11 = vsubps_avx(auVar147,auVar248);
  auVar249._0_4_ = fVar172 * auVar12._0_4_;
  auVar249._4_4_ = fVar186 * auVar12._4_4_;
  auVar249._8_4_ = fVar187 * auVar12._8_4_;
  auVar249._12_4_ = fVar188 * auVar12._12_4_;
  auVar237._0_4_ = fVar172 * auVar11._0_4_;
  auVar237._4_4_ = fVar186 * auVar11._4_4_;
  auVar237._8_4_ = fVar187 * auVar11._8_4_;
  auVar237._12_4_ = fVar188 * auVar11._12_4_;
  auVar112._0_4_ = fVar88 * auVar12._0_4_;
  auVar112._4_4_ = fVar59 * auVar12._4_4_;
  auVar112._8_4_ = fVar140 * auVar12._8_4_;
  auVar112._12_4_ = fVar214 * auVar12._12_4_;
  auVar148._0_4_ = fVar88 * auVar11._0_4_;
  auVar148._4_4_ = fVar59 * auVar11._4_4_;
  auVar148._8_4_ = fVar140 * auVar11._8_4_;
  auVar148._12_4_ = fVar214 * auVar11._12_4_;
  auVar12 = vminps_avx(auVar249,auVar237);
  auVar11 = vminps_avx(auVar112,auVar148);
  auVar12 = vminps_avx(auVar12,auVar11);
  auVar11 = vmaxps_avx(auVar237,auVar249);
  auVar62 = vmaxps_avx(auVar148,auVar112);
  auVar227 = vminps_avx(auVar255,auVar209);
  auVar105 = vminps_avx(auVar98,auVar222);
  auVar227 = vminps_avx(auVar227,auVar105);
  auVar12 = vhaddps_avx(auVar12,auVar227);
  auVar11 = vmaxps_avx(auVar62,auVar11);
  auVar62 = vmaxps_avx(auVar209,auVar255);
  auVar227 = vmaxps_avx(auVar222,auVar98);
  auVar62 = vmaxps_avx(auVar227,auVar62);
  auVar11 = vhaddps_avx(auVar11,auVar62);
  auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
  auVar11 = vshufps_avx(auVar11,auVar11,0xe8);
  auVar223._0_4_ = auVar130._0_4_ + auVar12._0_4_;
  auVar223._4_4_ = auVar130._4_4_ + auVar12._4_4_;
  auVar223._8_4_ = auVar130._8_4_ + auVar12._8_4_;
  auVar223._12_4_ = auVar130._12_4_ + auVar12._12_4_;
  auVar210._0_4_ = auVar130._0_4_ + auVar11._0_4_;
  auVar210._4_4_ = auVar130._4_4_ + auVar11._4_4_;
  auVar210._8_4_ = auVar130._8_4_ + auVar11._8_4_;
  auVar210._12_4_ = auVar130._12_4_ + auVar11._12_4_;
  auVar213 = ZEXT1664(auVar210);
  auVar12 = vmaxps_avx(auVar234,auVar223);
  auVar11 = vminps_avx(auVar210,auVar63);
  auVar12 = vcmpps_avx(auVar11,auVar12,1);
  auVar12 = vshufps_avx(auVar12,auVar12,0x50);
  if ((auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar12[0xf] < '\0')
  goto LAB_01157939;
  bVar52 = 0;
  if ((auVar185._0_4_ < auVar223._0_4_) && (bVar52 = 0, auVar210._0_4_ < auVar63._0_4_)) {
    auVar11 = vmovshdup_avx(auVar223);
    auVar12 = vcmpps_avx(auVar210,auVar63,1);
    bVar52 = auVar12[4] & auVar60._0_4_ < auVar11._0_4_;
  }
  auVar213 = ZEXT464(0x40400000);
  if (((3 < (uint)uVar54 || fVar58 < 0.001) | bVar52) != 1) goto LAB_011587c6;
  lVar51 = 0xc9;
  do {
    lVar51 = lVar51 + -1;
    if (lVar51 == 0) goto LAB_01157939;
    fVar59 = auVar130._0_4_;
    fVar88 = 1.0 - fVar59;
    fVar58 = fVar88 * fVar88 * fVar88;
    fVar86 = fVar59 * 3.0 * fVar88 * fVar88;
    fVar88 = fVar88 * fVar59 * fVar59 * 3.0;
    auVar136._4_4_ = fVar58;
    auVar136._0_4_ = fVar58;
    auVar136._8_4_ = fVar58;
    auVar136._12_4_ = fVar58;
    auVar113._4_4_ = fVar86;
    auVar113._0_4_ = fVar86;
    auVar113._8_4_ = fVar86;
    auVar113._12_4_ = fVar86;
    auVar99._4_4_ = fVar88;
    auVar99._0_4_ = fVar88;
    auVar99._8_4_ = fVar88;
    auVar99._12_4_ = fVar88;
    fVar59 = fVar59 * fVar59 * fVar59;
    auVar149._0_4_ = (float)local_218._0_4_ * fVar59;
    auVar149._4_4_ = (float)local_218._4_4_ * fVar59;
    auVar149._8_4_ = fStack_210 * fVar59;
    auVar149._12_4_ = fStack_20c * fVar59;
    auVar9 = vfmadd231ps_fma(auVar149,local_508,auVar99);
    auVar9 = vfmadd231ps_fma(auVar9,local_4f8,auVar113);
    auVar9 = vfmadd231ps_fma(auVar9,local_4e8,auVar136);
    auVar100._8_8_ = auVar9._0_8_;
    auVar100._0_8_ = auVar9._0_8_;
    auVar9 = vshufpd_avx(auVar9,auVar9,3);
    auVar12 = vshufps_avx(auVar130,auVar130,0x55);
    auVar9 = vsubps_avx(auVar9,auVar100);
    auVar12 = vfmadd213ps_fma(auVar9,auVar12,auVar100);
    fVar58 = auVar12._0_4_;
    auVar9 = vshufps_avx(auVar12,auVar12,0x55);
    auVar101._0_4_ = fVar116 * fVar58 + fVar87 * auVar9._0_4_;
    auVar101._4_4_ = auVar124._4_4_ * fVar58 + auVar10._4_4_ * auVar9._4_4_;
    auVar101._8_4_ = auVar124._8_4_ * fVar58 + auVar10._8_4_ * auVar9._8_4_;
    auVar101._12_4_ = auVar124._12_4_ * fVar58 + auVar10._12_4_ * auVar9._12_4_;
    auVar130 = vsubps_avx(auVar130,auVar101);
    auVar9 = vandps_avx(local_318,auVar12);
    auVar12 = vshufps_avx(auVar9,auVar9,0xf5);
    auVar9 = vmaxss_avx(auVar12,auVar9);
  } while ((float)local_228._0_4_ <= auVar9._0_4_);
  fVar58 = auVar130._0_4_;
  if ((fVar58 < 0.0) || (1.0 < fVar58)) goto LAB_01157939;
  auVar9 = vmovshdup_avx(auVar130);
  fVar86 = auVar9._0_4_;
  if ((fVar86 < 0.0) || (1.0 < fVar86)) goto LAB_01157939;
  auVar9 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                         ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar62 = vinsertps_avx(auVar9,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar1 = (ray->super_RayK<1>).org.field_0;
  auVar9 = vsubps_avx(local_448,(undefined1  [16])aVar1);
  auVar9 = vdpps_avx(auVar9,auVar62,0x7f);
  auVar12 = vsubps_avx(local_478,(undefined1  [16])aVar1);
  auVar12 = vdpps_avx(auVar12,auVar62,0x7f);
  auVar124 = vsubps_avx(local_488,(undefined1  [16])aVar1);
  auVar124 = vdpps_avx(auVar124,auVar62,0x7f);
  auVar10 = vsubps_avx(local_468,(undefined1  [16])aVar1);
  auVar10 = vdpps_avx(auVar10,auVar62,0x7f);
  auVar11 = vsubps_avx(_local_458,(undefined1  [16])aVar1);
  auVar11 = vdpps_avx(auVar11,auVar62,0x7f);
  auVar234 = vsubps_avx(_local_498,(undefined1  [16])aVar1);
  auVar234 = vdpps_avx(auVar234,auVar62,0x7f);
  auVar63 = vsubps_avx(_local_4a8,(undefined1  [16])aVar1);
  auVar63 = vdpps_avx(auVar63,auVar62,0x7f);
  auVar44._4_4_ = fStack_4b4;
  auVar44._0_4_ = local_4b8;
  auVar44._8_4_ = fStack_4b0;
  auVar44._12_4_ = fStack_4ac;
  auVar227 = vsubps_avx(auVar44,(undefined1  [16])aVar1);
  auVar62 = vdpps_avx(auVar227,auVar62,0x7f);
  fVar116 = 1.0 - fVar86;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar86)),ZEXT416((uint)fVar116),auVar9);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar234._0_4_ * fVar86)),ZEXT416((uint)fVar116),auVar12)
  ;
  auVar124 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * fVar86)),ZEXT416((uint)fVar116),auVar124
                            );
  auVar213 = ZEXT1664(auVar124);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar62._0_4_)),ZEXT416((uint)fVar116),auVar10);
  fVar88 = 1.0 - fVar58;
  fVar86 = fVar88 * fVar58 * fVar58 * 3.0;
  fVar140 = fVar58 * fVar58 * fVar58;
  auVar124 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar140)),ZEXT416((uint)fVar86),auVar124
                            );
  fVar116 = fVar58 * 3.0 * fVar88 * fVar88;
  auVar12 = vfmadd231ss_fma(auVar124,ZEXT416((uint)fVar116),auVar12);
  fVar87 = fVar88 * fVar88 * fVar88;
  auVar9 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar87),auVar9);
  fVar59 = auVar9._0_4_;
  if (((fVar59 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
      (fVar214 = (ray->super_RayK<1>).tfar, fVar214 < fVar59)) ||
     (pGVar4 = (context->scene->geometries).items[uVar48].ptr,
     (pGVar4->mask & (ray->super_RayK<1>).mask) == 0)) goto LAB_01157939;
  auVar9 = vshufps_avx(auVar130,auVar130,0x55);
  auVar196._8_4_ = 0x3f800000;
  auVar196._0_8_ = 0x3f8000003f800000;
  auVar196._12_4_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar196,auVar9);
  fVar172 = auVar9._0_4_;
  auVar211._0_4_ = fVar172 * (float)local_458._0_4_;
  fVar186 = auVar9._4_4_;
  auVar211._4_4_ = fVar186 * (float)local_458._4_4_;
  fVar187 = auVar9._8_4_;
  auVar211._8_4_ = fVar187 * fStack_450;
  fVar188 = auVar9._12_4_;
  auVar211._12_4_ = fVar188 * fStack_44c;
  auVar224._0_4_ = fVar172 * (float)local_498._0_4_;
  auVar224._4_4_ = fVar186 * (float)local_498._4_4_;
  auVar224._8_4_ = fVar187 * fStack_490;
  auVar224._12_4_ = fVar188 * fStack_48c;
  auVar230._0_4_ = fVar172 * (float)local_4a8._0_4_;
  auVar230._4_4_ = fVar186 * (float)local_4a8._4_4_;
  auVar230._8_4_ = fVar187 * fStack_4a0;
  auVar230._12_4_ = fVar188 * fStack_49c;
  auVar180._0_4_ = fVar172 * local_4b8;
  auVar180._4_4_ = fVar186 * fStack_4b4;
  auVar180._8_4_ = fVar187 * fStack_4b0;
  auVar180._12_4_ = fVar188 * fStack_4ac;
  auVar9 = vfmadd231ps_fma(auVar211,auVar12,local_448);
  auVar124 = vfmadd231ps_fma(auVar224,auVar12,local_478);
  auVar10 = vfmadd231ps_fma(auVar230,auVar12,local_488);
  auVar11 = vfmadd231ps_fma(auVar180,auVar12,local_468);
  auVar9 = vsubps_avx(auVar124,auVar9);
  auVar12 = vsubps_avx(auVar10,auVar124);
  auVar213 = ZEXT1664(auVar12);
  auVar124 = vsubps_avx(auVar11,auVar10);
  auVar231._0_4_ = fVar58 * auVar12._0_4_;
  auVar231._4_4_ = fVar58 * auVar12._4_4_;
  auVar231._8_4_ = fVar58 * auVar12._8_4_;
  auVar231._12_4_ = fVar58 * auVar12._12_4_;
  auVar170._4_4_ = fVar88;
  auVar170._0_4_ = fVar88;
  auVar170._8_4_ = fVar88;
  auVar170._12_4_ = fVar88;
  auVar9 = vfmadd231ps_fma(auVar231,auVar170,auVar9);
  auVar181._0_4_ = fVar58 * auVar124._0_4_;
  auVar181._4_4_ = fVar58 * auVar124._4_4_;
  auVar181._8_4_ = fVar58 * auVar124._8_4_;
  auVar181._12_4_ = fVar58 * auVar124._12_4_;
  auVar124 = vfmadd231ps_fma(auVar181,auVar170,auVar12);
  auVar182._0_4_ = fVar58 * auVar124._0_4_;
  auVar182._4_4_ = fVar58 * auVar124._4_4_;
  auVar182._8_4_ = fVar58 * auVar124._8_4_;
  auVar182._12_4_ = fVar58 * auVar124._12_4_;
  auVar124 = vfmadd231ps_fma(auVar182,auVar170,auVar9);
  auVar150._0_4_ = fVar140 * (float)local_278._0_4_;
  auVar150._4_4_ = fVar140 * (float)local_278._4_4_;
  auVar150._8_4_ = fVar140 * fStack_270;
  auVar150._12_4_ = fVar140 * fStack_26c;
  auVar114._4_4_ = fVar86;
  auVar114._0_4_ = fVar86;
  auVar114._8_4_ = fVar86;
  auVar114._12_4_ = fVar86;
  auVar9 = vfmadd132ps_fma(auVar114,auVar150,local_268);
  auVar137._4_4_ = fVar116;
  auVar137._0_4_ = fVar116;
  auVar137._8_4_ = fVar116;
  auVar137._12_4_ = fVar116;
  auVar9 = vfmadd132ps_fma(auVar137,auVar9,local_258);
  auVar151._0_4_ = auVar124._0_4_ * 3.0;
  auVar151._4_4_ = auVar124._4_4_ * 3.0;
  auVar151._8_4_ = auVar124._8_4_ * 3.0;
  auVar151._12_4_ = auVar124._12_4_ * 3.0;
  auVar127._4_4_ = fVar87;
  auVar127._0_4_ = fVar87;
  auVar127._8_4_ = fVar87;
  auVar127._12_4_ = fVar87;
  auVar124 = vfmadd132ps_fma(auVar127,auVar9,local_248);
  auVar9 = vshufps_avx(auVar151,auVar151,0xc9);
  auVar115._0_4_ = auVar124._0_4_ * auVar9._0_4_;
  auVar115._4_4_ = auVar124._4_4_ * auVar9._4_4_;
  auVar115._8_4_ = auVar124._8_4_ * auVar9._8_4_;
  auVar115._12_4_ = auVar124._12_4_ * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar124 = vfmsub231ps_fma(auVar115,auVar151,auVar9);
  auVar9 = vshufps_avx(auVar124,auVar124,0xe9);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = fVar59;
    uVar89 = vmovlps_avx(auVar9);
    *(undefined8 *)&(ray->Ng).field_0 = uVar89;
    (ray->Ng).field_0.field_0.z = auVar124._0_4_;
    uVar89 = vmovlps_avx(auVar130);
    ray->u = (float)(int)uVar89;
    ray->v = (float)(int)((ulong)uVar89 >> 0x20);
    ray->primID = (uint)local_4c0;
    ray->geomID = uVar48;
    ray->instID[0] = context->user->instID[0];
    ray->instPrimID[0] = context->user->instPrimID[0];
    goto LAB_01157939;
  }
  local_528._0_4_ = fVar214;
  local_2d8 = vmovlps_avx(auVar9);
  local_2d0 = auVar124._0_4_;
  local_2cc = vmovlps_avx(auVar130);
  local_2c4 = (uint)local_4c0;
  local_2c0 = uVar48;
  local_2bc = context->user->instID[0];
  local_2b8 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = fVar59;
  local_53c = -1;
  local_398.valid = &local_53c;
  local_398.geometryUserPtr = pGVar4->userPtr;
  local_398.context = context->user;
  local_398.ray = (RTCRayN *)ray;
  local_398.hit = (RTCHitN *)&local_2d8;
  local_398.N = 1;
  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    local_538._0_8_ = context;
    auVar213 = ZEXT1664(auVar12);
    (*pGVar4->intersectionFilterN)(&local_398);
    context = (RayQueryContext *)local_538._0_8_;
    if (*local_398.valid == 0) goto LAB_01158762;
  }
  p_Var7 = context->args->filter;
  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
    auVar213 = ZEXT1664(auVar213._0_16_);
    (*p_Var7)(&local_398);
    if (*local_398.valid == 0) {
LAB_01158762:
      (ray->super_RayK<1>).tfar = (float)local_528._0_4_;
      auVar18 = _local_528;
      goto LAB_01157939;
    }
  }
  (((Vec3f *)((long)local_398.ray + 0x30))->field_0).components[0] = *(float *)local_398.hit;
  (((Vec3f *)((long)local_398.ray + 0x30))->field_0).field_0.y = *(float *)(local_398.hit + 4);
  (((Vec3f *)((long)local_398.ray + 0x30))->field_0).field_0.z = *(float *)(local_398.hit + 8);
  *(float *)((long)local_398.ray + 0x3c) = *(float *)(local_398.hit + 0xc);
  *(float *)((long)local_398.ray + 0x40) = *(float *)(local_398.hit + 0x10);
  *(float *)((long)local_398.ray + 0x44) = *(float *)(local_398.hit + 0x14);
  *(float *)((long)local_398.ray + 0x48) = *(float *)(local_398.hit + 0x18);
  *(float *)((long)local_398.ray + 0x4c) = *(float *)(local_398.hit + 0x1c);
  *(float *)((long)local_398.ray + 0x50) = *(float *)(local_398.hit + 0x20);
  auVar18 = _local_528;
  goto LAB_01157939;
LAB_011587c6:
  local_238 = vinsertps_avx(auVar9,ZEXT416((uint)fVar86),0x10);
  local_538 = vinsertps_avx(auVar60,ZEXT416((uint)local_538._0_4_),0x10);
  goto LAB_01157388;
}

Assistant:

static __forceinline void intersect_hn(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }